

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_fma::forward_fp16s
          (InnerProduct_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined4 uVar20;
  int iVar21;
  _func_int *p_Var22;
  int *piVar23;
  void *pvVar24;
  size_t sVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  ulong uVar31;
  uint uVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  undefined1 (*pauVar38) [32];
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  int iVar42;
  long lVar43;
  undefined1 (*pauVar44) [16];
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  undefined1 (*pauVar50) [32];
  long lVar51;
  long lVar52;
  long lVar53;
  undefined1 (*pauVar54) [16];
  long lVar55;
  undefined1 (*pauVar56) [16];
  uint uVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  undefined1 (*pauVar63) [16];
  undefined1 auVar72 [16];
  undefined4 extraout_XMM0_Db_04;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar64 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined1 auVar81 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar88 [16];
  undefined1 auVar107 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar122 [64];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [28];
  undefined1 auVar155 [32];
  undefined1 auVar181 [16];
  undefined1 auVar157 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar134 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar209 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar180;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar222 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar244 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  v4sf one;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar314 [32];
  undefined1 auVar315 [64];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [64];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [64];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [64];
  undefined1 auVar360 [16];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [64];
  Option opt_flatten;
  undefined1 (*local_398) [32];
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 local_388;
  undefined4 uStack_384;
  int local_380;
  Allocator *local_378;
  int local_370;
  int iStack_36c;
  undefined8 uStack_368;
  undefined4 uStack_360;
  size_t local_358;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  float local_318;
  undefined1 local_308 [16];
  ulong local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  undefined1 local_2a8 [32];
  undefined1 local_288 [16];
  float local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined8 local_268;
  undefined1 local_258 [16];
  float local_248;
  undefined1 local_238 [16];
  ulong local_220;
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar380 [12];
  undefined1 auVar84 [32];
  float fVar87;
  undefined1 auVar108 [32];
  undefined1 auVar114 [32];
  float fVar123;
  undefined1 auVar156 [32];
  undefined1 auVar158 [32];
  
  local_370 = bottom_blob->dims;
  if ((local_370 == 2) &&
     (bottom_blob->w ==
      *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_fma[-3]) /
      *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]))) {
    if (1 < bottom_blob->elempack * bottom_blob->h) {
      Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]),
                  bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      p_Var22 = this->_vptr_InnerProduct_x86_fma[-3];
      innerproduct_gemm_fp16s_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 (Mat *)(&this->field_0x178 + (long)p_Var22),
                 *(int *)(&this->field_0xe0 + (long)p_Var22),
                 (Mat *)(&this->field_0xe8 + (long)p_Var22),opt);
      return 0;
    }
  }
  piVar23 = bottom_blob->refcount;
  local_398 = (undefined1 (*) [32])bottom_blob->data;
  uStack_390 = SUB84(bottom_blob->refcount,0);
  uStack_38c = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_388 = (undefined4)bottom_blob->elemsize;
  uStack_384 = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_380 = bottom_blob->elempack;
  local_378 = bottom_blob->allocator;
  uVar5 = bottom_blob->w;
  uVar6 = bottom_blob->h;
  uVar7 = bottom_blob->d;
  uVar8 = bottom_blob->c;
  auVar380._8_4_ = uVar8;
  auVar380._4_4_ = uVar7;
  auVar380._0_4_ = uVar6;
  uStack_368 = auVar380._0_8_;
  local_358 = bottom_blob->cstep;
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + 1;
    UNLOCK();
  }
  iStack_36c = uVar5;
  uStack_360 = uVar8;
  if (bottom_blob->dims != 1) {
    auVar155[0] = opt->lightmode;
    auVar155._1_3_ = *(undefined3 *)&opt->field_0x1;
    auVar155._4_4_ = opt->num_threads;
    auVar155._8_8_ = opt->blob_allocator;
    uVar9 = opt->workspace_allocator;
    uVar10 = opt->openmp_blocktime;
    uVar11 = opt->use_winograd_convolution;
    uVar12 = opt->use_sgemm_convolution;
    uVar13 = opt->use_int8_inference;
    uVar14 = opt->use_vulkan_compute;
    auVar155[0x1f] = uVar14;
    auVar155[0x1e] = uVar13;
    auVar155[0x1d] = uVar12;
    auVar155[0x1c] = uVar11;
    auVar155._24_4_ = uVar10;
    auVar155._16_8_ = uVar9;
    local_58._0_1_ = opt->use_bf16_storage;
    local_58._1_1_ = opt->use_fp16_packed;
    local_58._2_1_ = opt->use_fp16_storage;
    local_58._3_1_ = opt->use_fp16_arithmetic;
    local_58._4_1_ = opt->use_int8_packed;
    local_58._5_1_ = opt->use_int8_storage;
    local_58._6_1_ = opt->use_int8_arithmetic;
    local_58._7_1_ = opt->use_packing_layout;
    uStack_50._0_1_ = opt->use_shader_pack8;
    uStack_50._1_1_ = opt->use_subgroup_basic;
    uStack_50._2_1_ = opt->use_subgroup_vote;
    uStack_50._3_1_ = opt->use_subgroup_ballot;
    uStack_50._4_1_ = opt->use_subgroup_shuffle;
    uStack_50._5_1_ = opt->use_image_storage;
    uStack_50._6_1_ = opt->use_tensor_storage;
    uStack_50._7_1_ = opt->use_reserved_0;
    uStack_48._0_4_ = opt->flush_denormals;
    uStack_48._4_1_ = opt->use_local_pool_allocator;
    uStack_48._5_1_ = opt->use_shader_local_memory;
    uStack_48._6_1_ = opt->use_cooperative_matrix;
    uStack_48._7_1_ = opt->use_winograd23_convolution;
    uStack_40._0_1_ = opt->use_winograd43_convolution;
    uStack_40._1_1_ = opt->use_winograd63_convolution;
    uStack_40._2_1_ = opt->use_reserved_6;
    uStack_40._3_1_ = opt->use_reserved_7;
    uStack_40._4_1_ = opt->use_reserved_8;
    uStack_40._5_1_ = opt->use_reserved_9;
    uStack_40._6_1_ = opt->use_reserved_10;
    uStack_40._7_1_ = opt->use_reserved_11;
    local_78 = auVar155._0_8_;
    pAStack_70 = opt->workspace_allocator;
    auStack_68 = auVar155._16_16_;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_398);
  }
  lVar61 = 1;
  if (opt->use_packing_layout == true) {
    lVar61 = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]) & 7) != 0) {
      lVar61 = (ulong)((*(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]) &
                       3) == 0) * 3 + 1;
    }
  }
  iVar42 = (int)lVar61;
  Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]) /
                       iVar42,lVar61 * (CONCAT44(uStack_384,local_388) / (ulong)(long)local_380),
              iVar42,opt->blob_allocator);
  iVar36 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar36 = 0;
    if (iVar42 == 1) {
      p_Var22 = this->_vptr_InnerProduct_x86_fma[-3];
      iVar42 = *(int *)(&this->field_0xe0 + (long)p_Var22);
      uVar39 = local_380 * iStack_36c;
      iVar21 = top_blob->w;
      uVar40 = (ulong)iVar21;
      lVar61 = *(long *)(&this->field_0x178 + (long)p_Var22);
      if (0 < iVar21 >> 3) {
        local_220 = (ulong)(uint)(iVar21 >> 3);
        lVar46 = 1;
        lVar52 = 2;
        lVar47 = 3;
        lVar49 = 4;
        lVar51 = 5;
        lVar62 = 6;
        lVar55 = 7;
        lVar60 = 0;
        uVar41 = 0;
        do {
          local_2f0 = uVar41 * 8;
          auVar122 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar61 != 0) {
            auVar122 = ZEXT3264(*(undefined1 (*) [32])(lVar61 + uVar41 * 0x20));
          }
          auVar155 = auVar122._0_32_;
          lVar37 = (long)(this->weight_data_tm).w;
          pvVar24 = (this->weight_data_tm).data;
          sVar25 = (this->weight_data_tm).elemsize;
          pauVar38 = local_398;
          if ((int)uVar39 < 8) {
            lVar37 = sVar25 * lVar37;
            lVar34 = lVar37 * local_2f0;
            lVar35 = (local_2f0 | 1) * lVar37;
            lVar58 = (local_2f0 | 2) * lVar37;
            lVar45 = (local_2f0 | 3) * lVar37;
            lVar48 = (local_2f0 | 4) * lVar37;
            lVar53 = (local_2f0 | 5) * lVar37;
            lVar59 = (local_2f0 | 6) * lVar37;
            lVar37 = (local_2f0 | 7) * lVar37;
            uVar32 = 0;
            local_118 = SUB6432(ZEXT864(0),0);
            local_178 = SUB6432(ZEXT864(0),0);
            local_138 = SUB6432(ZEXT864(0),0);
            local_158 = SUB6432(ZEXT864(0),0);
            local_d8 = SUB6432(ZEXT864(0),0);
            local_f8 = SUB6432(ZEXT864(0),0);
            local_b8 = SUB6432(ZEXT864(0),0);
            local_98 = SUB6432(ZEXT864(0),0);
          }
          else {
            lVar34 = sVar25 * lVar60 * lVar37;
            lVar35 = sVar25 * lVar46 * lVar37;
            lVar58 = sVar25 * lVar52 * lVar37;
            lVar45 = sVar25 * lVar47 * lVar37;
            lVar48 = sVar25 * lVar49 * lVar37;
            lVar53 = sVar25 * lVar51 * lVar37;
            lVar59 = sVar25 * lVar62 * lVar37;
            lVar37 = sVar25 * lVar55 * lVar37;
            local_2a8._0_8_ = pvVar24;
            auVar213 = ZEXT864(0);
            auVar315 = ZEXT864(0);
            auVar179 = ZEXT864(0);
            auVar379 = ZEXT864(0);
            auVar359 = ZEXT864(0);
            auVar352 = ZEXT864(0);
            auVar344 = ZEXT864(0);
            auVar261 = ZEXT864(0);
            iVar36 = 7;
            lVar43 = 0;
            do {
              auVar83 = *(undefined1 (*) [32])(*local_398 + lVar43 * 2);
              auVar125 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar24 + lVar43 + lVar34));
              auVar111 = vcvtph2ps_f16c(auVar125);
              auVar125 = vfmadd231ps_fma(auVar261._0_32_,auVar83,auVar111);
              auVar261 = ZEXT1664(auVar125);
              local_118 = ZEXT1632(auVar125);
              auVar125 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar24 + lVar43 + lVar35));
              auVar111 = vcvtph2ps_f16c(auVar125);
              auVar125 = vfmadd231ps_fma(auVar344._0_32_,auVar83,auVar111);
              auVar344 = ZEXT1664(auVar125);
              local_178 = ZEXT1632(auVar125);
              auVar125 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar24 + lVar43 + lVar58));
              auVar111 = vcvtph2ps_f16c(auVar125);
              auVar125 = vfmadd231ps_fma(auVar352._0_32_,auVar83,auVar111);
              auVar352 = ZEXT1664(auVar125);
              local_138 = ZEXT1632(auVar125);
              auVar125 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar24 + lVar43 + lVar45));
              auVar111 = vcvtph2ps_f16c(auVar125);
              auVar125 = vfmadd231ps_fma(auVar359._0_32_,auVar83,auVar111);
              auVar359 = ZEXT1664(auVar125);
              local_158 = ZEXT1632(auVar125);
              auVar125 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar24 + lVar43 + lVar48));
              auVar111 = vcvtph2ps_f16c(auVar125);
              auVar125 = vfmadd231ps_fma(auVar379._0_32_,auVar83,auVar111);
              auVar379 = ZEXT1664(auVar125);
              local_d8 = ZEXT1632(auVar125);
              auVar125 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar24 + lVar43 + lVar53));
              auVar111 = vcvtph2ps_f16c(auVar125);
              auVar125 = vfmadd231ps_fma(auVar179._0_32_,auVar83,auVar111);
              auVar179 = ZEXT1664(auVar125);
              local_f8 = ZEXT1632(auVar125);
              auVar125 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar24 + lVar43 + lVar59));
              auVar111 = vcvtph2ps_f16c(auVar125);
              auVar125 = vfmadd231ps_fma(auVar315._0_32_,auVar83,auVar111);
              auVar315 = ZEXT1664(auVar125);
              local_b8 = ZEXT1632(auVar125);
              auVar125 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar24 + lVar43 + lVar37));
              auVar111 = vcvtph2ps_f16c(auVar125);
              auVar125 = vfmadd231ps_fma(auVar213._0_32_,auVar83,auVar111);
              auVar213 = ZEXT1664(auVar125);
              local_98 = ZEXT1632(auVar125);
              pauVar38 = pauVar38 + 1;
              lVar43 = lVar43 + 0x10;
              iVar36 = iVar36 + 8;
            } while (iVar36 < (int)uVar39);
            lVar34 = lVar34 + lVar43;
            lVar35 = lVar35 + lVar43;
            lVar58 = lVar58 + lVar43;
            lVar45 = lVar45 + lVar43;
            lVar48 = lVar48 + lVar43;
            lVar53 = lVar53 + lVar43;
            lVar59 = lVar59 + lVar43;
            lVar37 = lVar37 + lVar43;
            uVar32 = uVar39 & 0xfffffff8;
          }
          local_328._0_8_ = (long)pvVar24 + lVar34;
          local_338._0_8_ = (long)pvVar24 + lVar35;
          local_348._0_8_ = (long)pvVar24 + lVar58;
          local_2e8 = lVar60;
          local_2e0 = lVar55;
          local_2d8 = lVar62;
          local_2d0 = lVar51;
          local_2c8 = lVar49;
          local_2c0 = lVar47;
          local_2b8 = lVar52;
          local_2b0 = lVar46;
          if ((int)uVar32 < (int)uVar39) {
            lVar46 = 0;
            do {
              local_2a8 = auVar122._0_32_;
              uVar57 = *(uint *)(*pauVar38 + lVar46 * 4);
              fVar87 = float16_to_float32(*(unsigned_short *)(local_328._0_8_ + lVar46 * 2));
              auVar155 = local_218;
              local_218._4_4_ = extraout_XMM0_Db;
              local_218._0_4_ = fVar87;
              local_218._8_4_ = extraout_XMM0_Dc;
              local_218._16_16_ = auVar155._16_16_;
              local_218._12_4_ = extraout_XMM0_Dd;
              local_308 = ZEXT416(*(uint *)(*pauVar38 + lVar46 * 4));
              local_318 = float16_to_float32(*(unsigned_short *)(local_338._0_8_ + lVar46 * 2));
              local_238 = ZEXT416(*(uint *)(*pauVar38 + lVar46 * 4));
              local_248 = float16_to_float32(*(unsigned_short *)(local_348._0_8_ + lVar46 * 2));
              local_258 = ZEXT416(*(uint *)(*pauVar38 + lVar46 * 4));
              fVar87 = float16_to_float32(*(unsigned_short *)((long)pvVar24 + lVar46 * 2 + lVar45));
              local_268 = CONCAT44(extraout_XMM0_Db_00,fVar87);
              uVar2 = *(uint *)(*pauVar38 + lVar46 * 4);
              local_278 = float16_to_float32(*(unsigned_short *)
                                              ((long)pvVar24 + lVar46 * 2 + lVar48));
              local_198._0_16_ = ZEXT416(*(uint *)(*pauVar38 + lVar46 * 4));
              uStack_274 = extraout_XMM0_Db_01;
              uStack_270 = extraout_XMM0_Dc_00;
              uStack_26c = extraout_XMM0_Dd_00;
              fVar87 = float16_to_float32(*(unsigned_short *)((long)pvVar24 + lVar46 * 2 + lVar53));
              auVar155 = local_1b8;
              local_1b8._4_4_ = extraout_XMM0_Db_02;
              local_1b8._0_4_ = fVar87;
              local_1b8._8_4_ = extraout_XMM0_Dc_01;
              local_1b8._16_16_ = auVar155._16_16_;
              local_1b8._12_4_ = extraout_XMM0_Dd_01;
              local_1d8._0_16_ = ZEXT416(*(uint *)(*pauVar38 + lVar46 * 4));
              fVar87 = float16_to_float32(*(unsigned_short *)((long)pvVar24 + lVar46 * 2 + lVar59));
              auVar155 = local_1f8;
              local_1f8._4_4_ = extraout_XMM0_Db_03;
              local_1f8._0_4_ = fVar87;
              local_1f8._8_4_ = extraout_XMM0_Dc_02;
              local_1f8._16_16_ = auVar155._16_16_;
              local_1f8._12_4_ = extraout_XMM0_Dd_02;
              local_288 = ZEXT416(*(uint *)(*pauVar38 + lVar46 * 4));
              auVar122._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar24 + lVar46 * 2 + lVar37));
              auVar122._4_60_ = extraout_var;
              auVar125._4_4_ = uStack_274;
              auVar125._0_4_ = local_278;
              auVar125._8_4_ = uStack_270;
              auVar125._12_4_ = uStack_26c;
              auVar125 = vinsertps_avx(auVar125,ZEXT416((uint)local_1b8._0_4_),0x10);
              auVar125 = vinsertps_avx(auVar125,ZEXT416((uint)local_1f8._0_4_),0x20);
              auVar125 = vinsertps_avx(auVar125,auVar122._0_16_,0x30);
              auVar181 = vinsertps_avx(local_218._0_16_,ZEXT416((uint)local_318),0x10);
              auVar181 = vinsertps_avx(auVar181,ZEXT416((uint)local_248),0x20);
              auVar181 = vinsertps_avx(auVar181,ZEXT416((uint)local_268),0x30);
              auVar83._16_16_ = auVar125;
              auVar83._0_16_ = auVar181;
              auVar125 = vinsertps_avx(ZEXT416(uVar2),ZEXT416((uint)local_198._0_4_),0x10);
              auVar125 = vinsertps_avx(auVar125,ZEXT416((uint)local_1d8._0_4_),0x20);
              auVar125 = vinsertps_avx(auVar125,ZEXT416((uint)local_288._0_4_),0x30);
              auVar181 = vinsertps_avx(ZEXT416(uVar57),ZEXT416((uint)local_308._0_4_),0x10);
              auVar181 = vinsertps_avx(auVar181,ZEXT416((uint)local_238._0_4_),0x20);
              auVar181 = vinsertps_avx(auVar181,ZEXT416((uint)local_258._0_4_),0x30);
              auVar111._16_16_ = auVar125;
              auVar111._0_16_ = auVar181;
              auVar125 = vfmadd231ps_fma(local_2a8,auVar83,auVar111);
              auVar122 = ZEXT1664(auVar125);
              auVar155 = ZEXT1632(auVar125);
              lVar46 = lVar46 + 1;
            } while (uVar39 - uVar32 != (int)lVar46);
          }
          auVar83 = vhaddps_avx(local_118,local_178);
          auVar111 = vhaddps_avx(local_138,local_158);
          auVar111 = vhaddps_avx(auVar83,auVar111);
          auVar83 = vhaddps_avx(local_d8,local_f8);
          auVar81 = vhaddps_avx(local_b8,local_98);
          auVar81 = vhaddps_avx(auVar83,auVar81);
          auVar83 = vblendps_avx(auVar111,auVar81,0xf0);
          auVar111 = vperm2f128_avx(auVar111,auVar81,0x21);
          fVar87 = auVar111._0_4_ + auVar155._0_4_ + auVar83._0_4_;
          fVar123 = auVar111._4_4_ + auVar155._4_4_ + auVar83._4_4_;
          auVar81._0_8_ = CONCAT44(fVar123,fVar87);
          auVar81._8_4_ = auVar111._8_4_ + auVar155._8_4_ + auVar83._8_4_;
          auVar81._12_4_ = auVar111._12_4_ + auVar155._12_4_ + auVar83._12_4_;
          auVar81._16_4_ = auVar111._16_4_ + auVar155._16_4_ + auVar83._16_4_;
          auVar81._20_4_ = auVar111._20_4_ + auVar155._20_4_ + auVar83._20_4_;
          auVar81._24_4_ = auVar111._24_4_ + auVar155._24_4_ + auVar83._24_4_;
          auVar81._28_4_ = auVar111._28_4_ + auVar155._28_4_ + auVar83._28_4_;
          switch(iVar42) {
          case 1:
            auVar81 = vmaxps_avx(auVar81,_DAT_005513a0);
            break;
          case 2:
            auVar155 = vmaxps_avx(auVar81,ZEXT832(0) << 0x20);
            auVar83 = vminps_avx(auVar81,ZEXT832(0) << 0x20);
            uVar20 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var22);
            auVar86._4_4_ = uVar20;
            auVar86._0_4_ = uVar20;
            auVar86._8_4_ = uVar20;
            auVar86._12_4_ = uVar20;
            auVar86._16_4_ = uVar20;
            auVar86._20_4_ = uVar20;
            auVar86._24_4_ = uVar20;
            auVar86._28_4_ = uVar20;
            auVar125 = vfmadd213ps_fma(auVar86,auVar83,auVar155);
            auVar81 = ZEXT1632(auVar125);
            break;
          case 3:
            uVar20 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var22);
            auVar116._4_4_ = uVar20;
            auVar116._0_4_ = uVar20;
            auVar116._8_4_ = uVar20;
            auVar116._12_4_ = uVar20;
            auVar116._16_4_ = uVar20;
            auVar116._20_4_ = uVar20;
            auVar116._24_4_ = uVar20;
            auVar116._28_4_ = uVar20;
            uVar20 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var22))[1];
            auVar174._4_4_ = uVar20;
            auVar174._0_4_ = uVar20;
            auVar174._8_4_ = uVar20;
            auVar174._12_4_ = uVar20;
            auVar174._16_4_ = uVar20;
            auVar174._20_4_ = uVar20;
            auVar174._24_4_ = uVar20;
            auVar174._28_4_ = uVar20;
            auVar155 = vmaxps_avx(auVar81,auVar116);
            auVar81 = vminps_avx(auVar155,auVar174);
            break;
          case 4:
            auVar82._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
            auVar82._8_4_ = -auVar81._8_4_;
            auVar82._12_4_ = -auVar81._12_4_;
            auVar82._16_4_ = -auVar81._16_4_;
            auVar82._20_4_ = -auVar81._20_4_;
            auVar82._24_4_ = -auVar81._24_4_;
            auVar82._28_4_ = -auVar81._28_4_;
            auVar117._8_4_ = 0x42b0c0a5;
            auVar117._0_8_ = 0x42b0c0a542b0c0a5;
            auVar117._12_4_ = 0x42b0c0a5;
            auVar117._16_4_ = 0x42b0c0a5;
            auVar117._20_4_ = 0x42b0c0a5;
            auVar117._24_4_ = 0x42b0c0a5;
            auVar117._28_4_ = 0x42b0c0a5;
            auVar155 = vminps_avx(auVar82,auVar117);
            auVar118._8_4_ = 0xc2b0c0a5;
            auVar118._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar118._12_4_ = 0xc2b0c0a5;
            auVar118._16_4_ = 0xc2b0c0a5;
            auVar118._20_4_ = 0xc2b0c0a5;
            auVar118._24_4_ = 0xc2b0c0a5;
            auVar118._28_4_ = 0xc2b0c0a5;
            auVar83 = vmaxps_avx(auVar155,auVar118);
            auVar119._8_4_ = 0x3fb8aa3b;
            auVar119._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar119._12_4_ = 0x3fb8aa3b;
            auVar119._16_4_ = 0x3fb8aa3b;
            auVar119._20_4_ = 0x3fb8aa3b;
            auVar119._24_4_ = 0x3fb8aa3b;
            auVar119._28_4_ = 0x3fb8aa3b;
            auVar242._8_4_ = 0x3f000000;
            auVar242._0_8_ = 0x3f0000003f000000;
            auVar242._12_4_ = 0x3f000000;
            auVar242._16_4_ = 0x3f000000;
            auVar242._20_4_ = 0x3f000000;
            auVar242._24_4_ = 0x3f000000;
            auVar242._28_4_ = 0x3f000000;
            auVar125 = vfmadd213ps_fma(auVar119,auVar83,auVar242);
            auVar111 = vroundps_avx(ZEXT1632(auVar125),1);
            auVar155 = vcmpps_avx(ZEXT1632(auVar125),auVar111,1);
            auVar260._8_4_ = 0x3f800000;
            auVar260._0_8_ = 0x3f8000003f800000;
            auVar260._12_4_ = 0x3f800000;
            auVar260._16_4_ = 0x3f800000;
            auVar260._20_4_ = 0x3f800000;
            auVar260._24_4_ = 0x3f800000;
            auVar260._28_4_ = 0x3f800000;
            auVar155 = vandps_avx(auVar155,auVar260);
            auVar155 = vsubps_avx(auVar111,auVar155);
            auVar175._8_4_ = 0x3f318000;
            auVar175._0_8_ = 0x3f3180003f318000;
            auVar175._12_4_ = 0x3f318000;
            auVar175._16_4_ = 0x3f318000;
            auVar175._20_4_ = 0x3f318000;
            auVar175._24_4_ = 0x3f318000;
            auVar175._28_4_ = 0x3f318000;
            auVar125 = vfmsub231ps_fma(auVar83,auVar155,auVar175);
            auVar176._8_4_ = 0x395e8083;
            auVar176._0_8_ = 0x395e8083395e8083;
            auVar176._12_4_ = 0x395e8083;
            auVar176._16_4_ = 0x395e8083;
            auVar176._20_4_ = 0x395e8083;
            auVar176._24_4_ = 0x395e8083;
            auVar176._28_4_ = 0x395e8083;
            auVar181 = vfmsub231ps_fma(ZEXT1632(auVar125),auVar155,auVar176);
            auVar83 = ZEXT1632(auVar181);
            auVar30._28_4_ = 0x395e8083;
            auVar30._0_28_ =
                 ZEXT1628(CONCAT412(auVar181._12_4_ * auVar181._12_4_,
                                    CONCAT48(auVar181._8_4_ * auVar181._8_4_,
                                             CONCAT44(auVar181._4_4_ * auVar181._4_4_,
                                                      auVar181._0_4_ * auVar181._0_4_))));
            auVar212._8_4_ = 0x39506967;
            auVar212._0_8_ = 0x3950696739506967;
            auVar212._12_4_ = 0x39506967;
            auVar212._16_4_ = 0x39506967;
            auVar212._20_4_ = 0x39506967;
            auVar212._24_4_ = 0x39506967;
            auVar212._28_4_ = 0x39506967;
            auVar278._8_4_ = 0x3ab743ce;
            auVar278._0_8_ = 0x3ab743ce3ab743ce;
            auVar278._12_4_ = 0x3ab743ce;
            auVar278._16_4_ = 0x3ab743ce;
            auVar278._20_4_ = 0x3ab743ce;
            auVar278._24_4_ = 0x3ab743ce;
            auVar278._28_4_ = 0x3ab743ce;
            auVar125 = vfmadd213ps_fma(auVar212,auVar83,auVar278);
            auVar279._8_4_ = 0x3c088908;
            auVar279._0_8_ = 0x3c0889083c088908;
            auVar279._12_4_ = 0x3c088908;
            auVar279._16_4_ = 0x3c088908;
            auVar279._20_4_ = 0x3c088908;
            auVar279._24_4_ = 0x3c088908;
            auVar279._28_4_ = 0x3c088908;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar279);
            auVar280._8_4_ = 0x3d2aa9c1;
            auVar280._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar280._12_4_ = 0x3d2aa9c1;
            auVar280._16_4_ = 0x3d2aa9c1;
            auVar280._20_4_ = 0x3d2aa9c1;
            auVar280._24_4_ = 0x3d2aa9c1;
            auVar280._28_4_ = 0x3d2aa9c1;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar280);
            auVar281._8_4_ = 0x3e2aaaaa;
            auVar281._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar281._12_4_ = 0x3e2aaaaa;
            auVar281._16_4_ = 0x3e2aaaaa;
            auVar281._20_4_ = 0x3e2aaaaa;
            auVar281._24_4_ = 0x3e2aaaaa;
            auVar281._28_4_ = 0x3e2aaaaa;
            auVar83 = ZEXT1632(auVar181);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar281);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar242);
            auVar217 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar30,auVar83);
            auVar72._0_4_ = (int)auVar155._0_4_;
            auVar72._4_4_ = (int)auVar155._4_4_;
            auVar72._8_4_ = (int)auVar155._8_4_;
            auVar72._12_4_ = (int)auVar155._12_4_;
            auVar84._16_4_ = (int)auVar155._16_4_;
            auVar84._0_16_ = auVar72;
            auVar84._20_4_ = (int)auVar155._20_4_;
            auVar84._24_4_ = (int)auVar155._24_4_;
            auVar84._28_4_ = (int)auVar155._28_4_;
            auVar181 = vpslld_avx(auVar72,0x17);
            auVar125 = vpslld_avx(auVar84._16_16_,0x17);
            auVar134._8_4_ = 0x3f800000;
            auVar134._0_8_ = 0x3f8000003f800000;
            auVar134._12_4_ = 0x3f800000;
            auVar125 = vpaddd_avx(auVar125,auVar134);
            auVar181 = vpaddd_avx(auVar181,auVar134);
            auVar85._16_16_ = auVar125;
            auVar85._0_16_ = auVar181;
            auVar120._0_4_ = auVar217._0_4_ + 1.0;
            auVar120._4_4_ = auVar217._4_4_ + 1.0;
            auVar120._8_4_ = auVar217._8_4_ + 1.0;
            auVar120._12_4_ = auVar217._12_4_ + 1.0;
            auVar120._16_4_ = 0x3f800000;
            auVar120._20_4_ = 0x3f800000;
            auVar120._24_4_ = 0x3f800000;
            auVar120._28_4_ = 0x3f800000;
            auVar125 = vfmadd213ps_fma(auVar85,auVar120,auVar260);
            auVar155 = vrcpps_avx(ZEXT1632(auVar125));
            auVar125 = vfmsub213ps_fma(ZEXT1632(auVar125),auVar155,auVar260);
            auVar125 = vfnmadd132ps_fma(ZEXT1632(auVar125),auVar155,auVar155);
            auVar81 = ZEXT1632(auVar125);
            break;
          case 5:
            auVar292._8_4_ = 0x42b0c0a5;
            auVar292._0_8_ = 0x42b0c0a542b0c0a5;
            auVar292._12_4_ = 0x42b0c0a5;
            auVar292._16_4_ = 0x42b0c0a5;
            auVar292._20_4_ = 0x42b0c0a5;
            auVar292._24_4_ = 0x42b0c0a5;
            auVar292._28_4_ = 0x42b0c0a5;
            auVar155 = vminps_avx(auVar81,auVar292);
            auVar300._8_4_ = 0xc2b0c0a5;
            auVar300._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar300._12_4_ = 0xc2b0c0a5;
            auVar300._16_4_ = 0xc2b0c0a5;
            auVar300._20_4_ = 0xc2b0c0a5;
            auVar300._24_4_ = 0xc2b0c0a5;
            auVar300._28_4_ = 0xc2b0c0a5;
            auVar83 = vmaxps_avx(auVar300,auVar155);
            auVar166._8_4_ = 0x3fb8aa3b;
            auVar166._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar166._12_4_ = 0x3fb8aa3b;
            auVar166._16_4_ = 0x3fb8aa3b;
            auVar166._20_4_ = 0x3fb8aa3b;
            auVar166._24_4_ = 0x3fb8aa3b;
            auVar166._28_4_ = 0x3fb8aa3b;
            auVar314._8_4_ = 0x3f000000;
            auVar314._0_8_ = 0x3f0000003f000000;
            auVar314._12_4_ = 0x3f000000;
            auVar314._16_4_ = 0x3f000000;
            auVar314._20_4_ = 0x3f000000;
            auVar314._24_4_ = 0x3f000000;
            auVar314._28_4_ = 0x3f000000;
            auVar125 = vfmadd213ps_fma(auVar166,auVar83,auVar314);
            auVar111 = vroundps_avx(ZEXT1632(auVar125),1);
            auVar155 = vcmpps_avx(ZEXT1632(auVar125),auVar111,1);
            auVar351._8_4_ = 0x3f800000;
            auVar351._0_8_ = 0x3f8000003f800000;
            auVar351._12_4_ = 0x3f800000;
            auVar351._16_4_ = 0x3f800000;
            auVar351._20_4_ = 0x3f800000;
            auVar351._24_4_ = 0x3f800000;
            auVar351._28_4_ = 0x3f800000;
            auVar155 = vandps_avx(auVar351,auVar155);
            auVar155 = vsubps_avx(auVar111,auVar155);
            auVar358._8_4_ = 0x3f318000;
            auVar358._0_8_ = 0x3f3180003f318000;
            auVar358._12_4_ = 0x3f318000;
            auVar358._16_4_ = 0x3f318000;
            auVar358._20_4_ = 0x3f318000;
            auVar358._24_4_ = 0x3f318000;
            auVar358._28_4_ = 0x3f318000;
            auVar125 = vfmsub231ps_fma(auVar83,auVar155,auVar358);
            auVar301._8_4_ = 0xb95e8083;
            auVar301._0_8_ = 0xb95e8083b95e8083;
            auVar301._12_4_ = 0xb95e8083;
            auVar301._16_4_ = 0xb95e8083;
            auVar301._20_4_ = 0xb95e8083;
            auVar301._24_4_ = 0xb95e8083;
            auVar301._28_4_ = 0xb95e8083;
            auVar181 = vfnmsub231ps_fma(ZEXT1632(auVar125),auVar155,auVar301);
            auVar83 = ZEXT1632(auVar181);
            auVar105._28_4_ = auVar111._28_4_;
            auVar105._0_28_ =
                 ZEXT1628(CONCAT412(auVar181._12_4_ * auVar181._12_4_,
                                    CONCAT48(auVar181._8_4_ * auVar181._8_4_,
                                             CONCAT44(auVar181._4_4_ * auVar181._4_4_,
                                                      auVar181._0_4_ * auVar181._0_4_))));
            auVar371._8_4_ = 0x39506967;
            auVar371._0_8_ = 0x3950696739506967;
            auVar371._12_4_ = 0x39506967;
            auVar371._16_4_ = 0x39506967;
            auVar371._20_4_ = 0x39506967;
            auVar371._24_4_ = 0x39506967;
            auVar371._28_4_ = 0x39506967;
            auVar363._8_4_ = 0x3ab743ce;
            auVar363._0_8_ = 0x3ab743ce3ab743ce;
            auVar363._12_4_ = 0x3ab743ce;
            auVar363._16_4_ = 0x3ab743ce;
            auVar363._20_4_ = 0x3ab743ce;
            auVar363._24_4_ = 0x3ab743ce;
            auVar363._28_4_ = 0x3ab743ce;
            auVar125 = vfmadd213ps_fma(auVar371,auVar83,auVar363);
            auVar378._8_4_ = 0x3c088908;
            auVar378._0_8_ = 0x3c0889083c088908;
            auVar378._12_4_ = 0x3c088908;
            auVar378._16_4_ = 0x3c088908;
            auVar378._20_4_ = 0x3c088908;
            auVar378._24_4_ = 0x3c088908;
            auVar378._28_4_ = 0x3c088908;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar378);
            auVar253._8_4_ = 0x3d2aa9c1;
            auVar253._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar253._12_4_ = 0x3d2aa9c1;
            auVar253._16_4_ = 0x3d2aa9c1;
            auVar253._20_4_ = 0x3d2aa9c1;
            auVar253._24_4_ = 0x3d2aa9c1;
            auVar253._28_4_ = 0x3d2aa9c1;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar253);
            auVar254._8_4_ = 0x3e2aaaaa;
            auVar254._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar254._12_4_ = 0x3e2aaaaa;
            auVar254._16_4_ = 0x3e2aaaaa;
            auVar254._20_4_ = 0x3e2aaaaa;
            auVar254._24_4_ = 0x3e2aaaaa;
            auVar254._28_4_ = 0x3e2aaaaa;
            auVar83 = ZEXT1632(auVar181);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar254);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar314);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar105,auVar83);
            auVar209._0_4_ = auVar125._0_4_ + 1.0;
            auVar209._4_4_ = auVar125._4_4_ + 1.0;
            auVar209._8_4_ = auVar125._8_4_ + 1.0;
            auVar209._12_4_ = auVar125._12_4_ + 1.0;
            auVar209._16_4_ = 0x3f800000;
            auVar209._20_4_ = 0x3f800000;
            auVar209._24_4_ = 0x3f800000;
            auVar209._28_4_ = 0x3f800000;
            auVar181._0_4_ = (int)auVar155._0_4_;
            auVar181._4_4_ = (int)auVar155._4_4_;
            auVar181._8_4_ = (int)auVar155._8_4_;
            auVar181._12_4_ = (int)auVar155._12_4_;
            auVar112._16_4_ = (int)auVar155._16_4_;
            auVar112._0_16_ = auVar181;
            auVar112._20_4_ = (int)auVar155._20_4_;
            auVar112._24_4_ = (int)auVar155._24_4_;
            auVar112._28_4_ = (int)auVar155._28_4_;
            auVar181 = vpslld_avx(auVar181,0x17);
            auVar125 = vpslld_avx(auVar112._16_16_,0x17);
            auVar284._8_4_ = 0x3f800000;
            auVar284._0_8_ = 0x3f8000003f800000;
            auVar284._12_4_ = 0x3f800000;
            auVar125 = vpaddd_avx(auVar125,auVar284);
            auVar181 = vpaddd_avx(auVar181,auVar284);
            auVar113._16_16_ = auVar125;
            auVar113._0_16_ = auVar181;
            auVar217 = vfmadd213ps_fma(auVar113,auVar209,auVar351);
            auVar167._8_4_ = 0x800000;
            auVar167._0_8_ = 0x80000000800000;
            auVar167._12_4_ = 0x800000;
            auVar167._16_4_ = 0x800000;
            auVar167._20_4_ = 0x800000;
            auVar167._24_4_ = 0x800000;
            auVar167._28_4_ = 0x800000;
            auVar155 = vmaxps_avx(ZEXT1632(auVar217),auVar167);
            auVar181 = vpsrld_avx(auVar155._0_16_,0x17);
            auVar125 = vpsrld_avx(auVar155._16_16_,0x17);
            auVar255._8_4_ = 0x807fffff;
            auVar255._0_8_ = 0x807fffff807fffff;
            auVar255._12_4_ = 0x807fffff;
            auVar255._16_4_ = 0x807fffff;
            auVar255._20_4_ = 0x807fffff;
            auVar255._24_4_ = 0x807fffff;
            auVar255._28_4_ = 0x807fffff;
            auVar155 = vandps_avx(auVar155,auVar255);
            auVar111 = vorps_avx(auVar314,auVar155);
            auVar256._8_4_ = 0x3f3504f3;
            auVar256._0_8_ = 0x3f3504f33f3504f3;
            auVar256._12_4_ = 0x3f3504f3;
            auVar256._16_4_ = 0x3f3504f3;
            auVar256._20_4_ = 0x3f3504f3;
            auVar256._24_4_ = 0x3f3504f3;
            auVar256._28_4_ = 0x3f3504f3;
            auVar83 = vcmpps_avx(auVar256,auVar111,2);
            auVar155 = vandnps_avx(auVar83,auVar111);
            auVar343._8_4_ = 0xbf800000;
            auVar343._0_8_ = 0xbf800000bf800000;
            auVar343._12_4_ = 0xbf800000;
            auVar343._16_4_ = 0xbf800000;
            auVar343._20_4_ = 0xbf800000;
            auVar343._24_4_ = 0xbf800000;
            auVar343._28_4_ = 0xbf800000;
            auVar168._0_4_ = auVar111._0_4_ + -1.0 + auVar155._0_4_;
            auVar168._4_4_ = auVar111._4_4_ + -1.0 + auVar155._4_4_;
            auVar168._8_4_ = auVar111._8_4_ + -1.0 + auVar155._8_4_;
            auVar168._12_4_ = auVar111._12_4_ + -1.0 + auVar155._12_4_;
            auVar168._16_4_ = auVar111._16_4_ + -1.0 + auVar155._16_4_;
            auVar168._20_4_ = auVar111._20_4_ + -1.0 + auVar155._20_4_;
            auVar168._24_4_ = auVar111._24_4_ + -1.0 + auVar155._24_4_;
            auVar168._28_4_ = auVar111._28_4_ + -1.0 + auVar155._28_4_;
            auVar125 = vpsubd_avx(auVar125,auVar83._16_16_);
            auVar263._8_4_ = 0xffffff81;
            auVar263._0_8_ = 0xffffff81ffffff81;
            auVar263._12_4_ = 0xffffff81;
            auVar125 = vpaddd_avx(auVar125,auVar263);
            auVar181 = vpsubd_avx(auVar181,auVar83._0_16_);
            auVar181 = vpaddd_avx(auVar181,auVar263);
            auVar210._16_16_ = auVar125;
            auVar210._0_16_ = auVar181;
            auVar241._0_4_ = auVar168._0_4_ * auVar168._0_4_;
            auVar241._4_4_ = auVar168._4_4_ * auVar168._4_4_;
            auVar241._8_4_ = auVar168._8_4_ * auVar168._8_4_;
            auVar241._12_4_ = auVar168._12_4_ * auVar168._12_4_;
            auVar241._16_4_ = auVar168._16_4_ * auVar168._16_4_;
            auVar241._20_4_ = auVar168._20_4_ * auVar168._20_4_;
            auVar241._24_4_ = auVar168._24_4_ * auVar168._24_4_;
            auVar241._28_4_ = 0;
            auVar257._8_4_ = 0x3d9021bb;
            auVar257._0_8_ = 0x3d9021bb3d9021bb;
            auVar257._12_4_ = 0x3d9021bb;
            auVar257._16_4_ = 0x3d9021bb;
            auVar257._20_4_ = 0x3d9021bb;
            auVar257._24_4_ = 0x3d9021bb;
            auVar257._28_4_ = 0x3d9021bb;
            auVar268._8_4_ = 0xbdebd1b8;
            auVar268._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar268._12_4_ = 0xbdebd1b8;
            auVar268._16_4_ = 0xbdebd1b8;
            auVar268._20_4_ = 0xbdebd1b8;
            auVar268._24_4_ = 0xbdebd1b8;
            auVar268._28_4_ = 0xbdebd1b8;
            auVar125 = vfmadd213ps_fma(auVar257,auVar168,auVar268);
            auVar269._8_4_ = 0x3def251a;
            auVar269._0_8_ = 0x3def251a3def251a;
            auVar269._12_4_ = 0x3def251a;
            auVar269._16_4_ = 0x3def251a;
            auVar269._20_4_ = 0x3def251a;
            auVar269._24_4_ = 0x3def251a;
            auVar269._28_4_ = 0x3def251a;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar168,auVar269);
            auVar270._8_4_ = 0xbdfe5d4f;
            auVar270._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar270._12_4_ = 0xbdfe5d4f;
            auVar270._16_4_ = 0xbdfe5d4f;
            auVar270._20_4_ = 0xbdfe5d4f;
            auVar270._24_4_ = 0xbdfe5d4f;
            auVar270._28_4_ = 0xbdfe5d4f;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar168,auVar270);
            auVar271._8_4_ = 0x3e11e9bf;
            auVar271._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar271._12_4_ = 0x3e11e9bf;
            auVar271._16_4_ = 0x3e11e9bf;
            auVar271._20_4_ = 0x3e11e9bf;
            auVar271._24_4_ = 0x3e11e9bf;
            auVar271._28_4_ = 0x3e11e9bf;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar168,auVar271);
            auVar272._8_4_ = 0xbe2aae50;
            auVar272._0_8_ = 0xbe2aae50be2aae50;
            auVar272._12_4_ = 0xbe2aae50;
            auVar272._16_4_ = 0xbe2aae50;
            auVar272._20_4_ = 0xbe2aae50;
            auVar272._24_4_ = 0xbe2aae50;
            auVar272._28_4_ = 0xbe2aae50;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar168,auVar272);
            auVar273._8_4_ = 0x3e4cceac;
            auVar273._0_8_ = 0x3e4cceac3e4cceac;
            auVar273._12_4_ = 0x3e4cceac;
            auVar273._16_4_ = 0x3e4cceac;
            auVar273._20_4_ = 0x3e4cceac;
            auVar273._24_4_ = 0x3e4cceac;
            auVar273._28_4_ = 0x3e4cceac;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar168,auVar273);
            auVar274._8_4_ = 0xbe7ffffc;
            auVar274._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar274._12_4_ = 0xbe7ffffc;
            auVar274._16_4_ = 0xbe7ffffc;
            auVar274._20_4_ = 0xbe7ffffc;
            auVar274._24_4_ = 0xbe7ffffc;
            auVar274._28_4_ = 0xbe7ffffc;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar168,auVar274);
            auVar275._8_4_ = 0x3eaaaaaa;
            auVar275._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar275._12_4_ = 0x3eaaaaaa;
            auVar275._16_4_ = 0x3eaaaaaa;
            auVar275._20_4_ = 0x3eaaaaaa;
            auVar275._24_4_ = 0x3eaaaaaa;
            auVar275._28_4_ = 0x3eaaaaaa;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar168,auVar275);
            auVar258._0_4_ = auVar241._0_4_ * auVar168._0_4_ * auVar125._0_4_;
            auVar258._4_4_ = auVar241._4_4_ * auVar168._4_4_ * auVar125._4_4_;
            auVar258._8_4_ = auVar241._8_4_ * auVar168._8_4_ * auVar125._8_4_;
            auVar258._12_4_ = auVar241._12_4_ * auVar168._12_4_ * auVar125._12_4_;
            auVar258._16_4_ = auVar241._16_4_ * auVar168._16_4_ * 0.0;
            auVar258._20_4_ = auVar241._20_4_ * auVar168._20_4_ * 0.0;
            auVar258._24_4_ = auVar241._24_4_ * auVar168._24_4_ * 0.0;
            auVar258._28_4_ = 0;
            auVar83 = vcvtdq2ps_avx(auVar210);
            auVar125 = vfmadd231ps_fma(auVar258,auVar83,auVar301);
            auVar125 = vfmsub231ps_fma(ZEXT1632(auVar125),auVar314,auVar241);
            auVar155 = vcmpps_avx(ZEXT1632(auVar217),_DAT_005513a0,2);
            auVar111 = vsubps_avx(ZEXT1632(auVar125),auVar168);
            auVar125 = vfmsub231ps_fma(auVar111,auVar358,auVar83);
            auVar259._8_4_ = 0xc0000000;
            auVar259._0_8_ = 0xc0000000c0000000;
            auVar259._12_4_ = 0xc0000000;
            auVar259._16_4_ = 0xc0000000;
            auVar259._20_4_ = 0xc0000000;
            auVar259._24_4_ = 0xc0000000;
            auVar259._28_4_ = 0xc0000000;
            auVar169._0_4_ = auVar125._0_4_ * -2.0;
            auVar169._4_4_ = auVar125._4_4_ * -2.0;
            auVar169._8_4_ = auVar125._8_4_ * -2.0;
            auVar169._12_4_ = auVar125._12_4_ * -2.0;
            auVar169._16_4_ = 0x80000000;
            auVar169._20_4_ = 0x80000000;
            auVar169._24_4_ = 0x80000000;
            auVar169._28_4_ = 0;
            auVar211._8_4_ = 0x7fffffff;
            auVar211._0_8_ = 0x7fffffff7fffffff;
            auVar211._12_4_ = 0x7fffffff;
            auVar211._16_4_ = 0x7fffffff;
            auVar211._20_4_ = 0x7fffffff;
            auVar211._24_4_ = 0x7fffffff;
            auVar211._28_4_ = 0x7fffffff;
            auVar155 = vblendvps_avx(auVar169,auVar211,auVar155);
            auVar170._8_4_ = 0x42b0c0a5;
            auVar170._0_8_ = 0x42b0c0a542b0c0a5;
            auVar170._12_4_ = 0x42b0c0a5;
            auVar170._16_4_ = 0x42b0c0a5;
            auVar170._20_4_ = 0x42b0c0a5;
            auVar170._24_4_ = 0x42b0c0a5;
            auVar170._28_4_ = 0x42b0c0a5;
            auVar155 = vminps_avx(auVar155,auVar170);
            auVar171._8_4_ = 0xc2b0c0a5;
            auVar171._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar171._12_4_ = 0xc2b0c0a5;
            auVar171._16_4_ = 0xc2b0c0a5;
            auVar171._20_4_ = 0xc2b0c0a5;
            auVar171._24_4_ = 0xc2b0c0a5;
            auVar171._28_4_ = 0xc2b0c0a5;
            auVar83 = vmaxps_avx(auVar155,auVar171);
            auVar172._8_4_ = 0x3fb8aa3b;
            auVar172._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar172._12_4_ = 0x3fb8aa3b;
            auVar172._16_4_ = 0x3fb8aa3b;
            auVar172._20_4_ = 0x3fb8aa3b;
            auVar172._24_4_ = 0x3fb8aa3b;
            auVar172._28_4_ = 0x3fb8aa3b;
            auVar125 = vfmadd213ps_fma(auVar172,auVar83,auVar314);
            auVar111 = vroundps_avx(ZEXT1632(auVar125),1);
            auVar155 = vcmpps_avx(ZEXT1632(auVar125),auVar111,1);
            auVar155 = vandps_avx(auVar351,auVar155);
            auVar155 = vsubps_avx(auVar111,auVar155);
            auVar125 = vfmsub231ps_fma(auVar83,auVar155,auVar358);
            auVar181 = vfnmsub231ps_fma(ZEXT1632(auVar125),auVar155,auVar301);
            auVar83 = ZEXT1632(auVar181);
            auVar29._28_4_ = auVar111._28_4_;
            auVar29._0_28_ =
                 ZEXT1628(CONCAT412(auVar181._12_4_ * auVar181._12_4_,
                                    CONCAT48(auVar181._8_4_ * auVar181._8_4_,
                                             CONCAT44(auVar181._4_4_ * auVar181._4_4_,
                                                      auVar181._0_4_ * auVar181._0_4_))));
            auVar125 = vfmadd213ps_fma(auVar371,auVar83,auVar363);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar378);
            auVar276._8_4_ = 0x3d2aa9c1;
            auVar276._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar276._12_4_ = 0x3d2aa9c1;
            auVar276._16_4_ = 0x3d2aa9c1;
            auVar276._20_4_ = 0x3d2aa9c1;
            auVar276._24_4_ = 0x3d2aa9c1;
            auVar276._28_4_ = 0x3d2aa9c1;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar276);
            auVar277._8_4_ = 0x3e2aaaaa;
            auVar277._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar277._12_4_ = 0x3e2aaaaa;
            auVar277._16_4_ = 0x3e2aaaaa;
            auVar277._20_4_ = 0x3e2aaaaa;
            auVar277._24_4_ = 0x3e2aaaaa;
            auVar277._28_4_ = 0x3e2aaaaa;
            auVar83 = ZEXT1632(auVar181);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar277);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar314);
            auVar217 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar29,auVar83);
            auVar93._0_4_ = (int)auVar155._0_4_;
            auVar93._4_4_ = (int)auVar155._4_4_;
            auVar93._8_4_ = (int)auVar155._8_4_;
            auVar93._12_4_ = (int)auVar155._12_4_;
            auVar114._16_4_ = (int)auVar155._16_4_;
            auVar114._0_16_ = auVar93;
            auVar114._20_4_ = (int)auVar155._20_4_;
            auVar114._24_4_ = (int)auVar155._24_4_;
            auVar114._28_4_ = (int)auVar155._28_4_;
            auVar181 = vpslld_avx(auVar93,0x17);
            auVar125 = vpslld_avx(auVar114._16_16_,0x17);
            auVar125 = vpaddd_avx(auVar125,auVar284);
            auVar181 = vpaddd_avx(auVar181,auVar284);
            auVar115._16_16_ = auVar125;
            auVar115._0_16_ = auVar181;
            auVar173._0_4_ = auVar217._0_4_ + 1.0;
            auVar173._4_4_ = auVar217._4_4_ + 1.0;
            auVar173._8_4_ = auVar217._8_4_ + 1.0;
            auVar173._12_4_ = auVar217._12_4_ + 1.0;
            auVar173._16_4_ = 0x3f800000;
            auVar173._20_4_ = 0x3f800000;
            auVar173._24_4_ = 0x3f800000;
            auVar173._28_4_ = 0x3f800000;
            auVar125 = vfmadd213ps_fma(auVar115,auVar173,auVar351);
            auVar155 = vrcpps_avx(ZEXT1632(auVar125));
            auVar125 = vfmsub213ps_fma(ZEXT1632(auVar125),auVar155,auVar351);
            auVar125 = vfnmadd132ps_fma(ZEXT1632(auVar125),auVar155,auVar155);
            auVar125 = vfnmadd213ps_fma(ZEXT1632(auVar125),auVar259,auVar343);
            auVar154 = ZEXT1628(auVar125);
            goto LAB_003205dd;
          case 6:
            uVar20 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var22);
            auVar121._4_4_ = uVar20;
            auVar121._0_4_ = uVar20;
            auVar121._8_4_ = uVar20;
            auVar121._12_4_ = uVar20;
            auVar121._16_4_ = uVar20;
            auVar121._20_4_ = uVar20;
            auVar121._24_4_ = uVar20;
            auVar121._28_4_ = uVar20;
            uVar20 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var22))[1];
            auVar177._4_4_ = uVar20;
            auVar177._0_4_ = uVar20;
            auVar177._8_4_ = uVar20;
            auVar177._12_4_ = uVar20;
            auVar177._16_4_ = uVar20;
            auVar177._20_4_ = uVar20;
            auVar177._24_4_ = uVar20;
            auVar177._28_4_ = uVar20;
            auVar125 = vfmadd231ps_fma(auVar177,auVar81,auVar121);
            auVar155 = vmaxps_avx(ZEXT1632(auVar125),_DAT_005513a0);
            auVar178._8_4_ = 0x3f800000;
            auVar178._0_8_ = 0x3f8000003f800000;
            auVar178._12_4_ = 0x3f800000;
            auVar178._16_4_ = 0x3f800000;
            auVar178._20_4_ = 0x3f800000;
            auVar178._24_4_ = 0x3f800000;
            auVar178._28_4_ = 0x3f800000;
            auVar155 = vminps_avx(auVar155,auVar178);
            auVar154 = auVar155._0_28_;
LAB_003205dd:
            auVar81._4_4_ = auVar154._4_4_ * fVar123;
            auVar81._0_4_ = auVar154._0_4_ * fVar87;
            auVar81._8_4_ = auVar154._8_4_ * auVar81._8_4_;
            auVar81._12_4_ = auVar154._12_4_ * auVar81._12_4_;
            auVar81._16_4_ = auVar154._16_4_ * auVar81._16_4_;
            auVar81._20_4_ = auVar154._20_4_ * auVar81._20_4_;
            auVar81._24_4_ = auVar154._24_4_ * auVar81._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + local_2f0 * 4) = auVar81;
          uVar41 = uVar41 + 1;
          lVar60 = local_2e8 + 8;
          lVar46 = local_2b0 + 8;
          lVar52 = local_2b8 + 8;
          lVar47 = local_2c0 + 8;
          lVar49 = local_2c8 + 8;
          lVar51 = local_2d0 + 8;
          lVar62 = local_2d8 + 8;
          lVar55 = local_2e0 + 8;
        } while (uVar41 != local_220);
      }
      uVar41 = uVar40 & 0xfffffffffffffff8;
      fVar87 = (float)((uint)(uVar40 >> 2) & 1);
      if ((uVar40 >> 2 & 1) != 0) {
        uStack_274 = 0;
        if (lVar61 == 0) {
          auVar125 = ZEXT816(0) << 0x40;
        }
        else {
          auVar125 = *(undefined1 (*) [16])(lVar61 + uVar41 * 4);
        }
        pvVar24 = (this->weight_data_tm).data;
        lVar46 = (long)(this->weight_data_tm).w * (this->weight_data_tm).elemsize;
        pauVar44 = (undefined1 (*) [16])(lVar46 * uVar41 + (long)pvVar24);
        pauVar63 = (undefined1 (*) [16])((uVar41 | 1) * lVar46 + (long)pvVar24);
        pauVar54 = (undefined1 (*) [16])((uVar41 | 2) * lVar46 + (long)pvVar24);
        pauVar56 = (undefined1 (*) [16])((uVar41 | 3) * lVar46 + (long)pvVar24);
        pauVar38 = local_398;
        if ((int)uVar39 < 8) {
          uVar32 = 0;
          local_1b8 = SUB6432(ZEXT864(0),0);
          local_1f8 = SUB6432(ZEXT864(0),0);
          local_1d8 = SUB6432(ZEXT864(0),0);
          local_198 = SUB6432(ZEXT864(0),0);
        }
        else {
          uVar32 = uVar39 & 0xfffffff8;
          auVar122 = ZEXT864(0);
          iVar36 = 7;
          auVar315 = ZEXT864(0);
          auVar379 = ZEXT864(0);
          auVar213 = ZEXT864(0);
          do {
            auVar155 = *pauVar38;
            auVar181 = vlddqu_avx(*pauVar44);
            auVar83 = vcvtph2ps_f16c(auVar181);
            auVar181 = vlddqu_avx(*pauVar63);
            auVar111 = vcvtph2ps_f16c(auVar181);
            auVar181 = vlddqu_avx(*pauVar54);
            auVar81 = vcvtph2ps_f16c(auVar181);
            auVar181 = vlddqu_avx(*pauVar56);
            auVar121 = vcvtph2ps_f16c(auVar181);
            auVar181 = vfmadd231ps_fma(auVar213._0_32_,auVar155,auVar83);
            auVar213 = ZEXT1664(auVar181);
            local_1b8 = ZEXT1632(auVar181);
            auVar181 = vfmadd231ps_fma(auVar379._0_32_,auVar155,auVar111);
            auVar379 = ZEXT1664(auVar181);
            local_1f8 = ZEXT1632(auVar181);
            auVar181 = vfmadd231ps_fma(auVar315._0_32_,auVar155,auVar81);
            auVar315 = ZEXT1664(auVar181);
            local_1d8 = ZEXT1632(auVar181);
            auVar181 = vfmadd231ps_fma(auVar122._0_32_,auVar155,auVar121);
            auVar122 = ZEXT1664(auVar181);
            local_198 = ZEXT1632(auVar181);
            pauVar38 = pauVar38 + 1;
            pauVar44 = pauVar44 + 1;
            pauVar63 = pauVar63 + 1;
            pauVar54 = pauVar54 + 1;
            pauVar56 = pauVar56 + 1;
            iVar36 = iVar36 + 8;
          } while (iVar36 < (int)uVar39);
        }
        local_288 = ZEXT816(0) << 0x40;
        if ((int)(uVar32 | 3) < (int)uVar39) {
          auVar122 = ZEXT864(0);
          lVar46 = 0;
          auVar213 = ZEXT864(0);
          local_348 = ZEXT816(0);
          pauVar50 = pauVar38;
          uVar57 = uVar32;
          do {
            auVar217._8_8_ = 0;
            auVar217._0_8_ = *(ulong *)(*pauVar44 + lVar46);
            auVar217 = vcvtph2ps_f16c(auVar217);
            auVar16._8_8_ = 0;
            auVar16._0_8_ = *(ulong *)(*pauVar63 + lVar46);
            auVar93 = vcvtph2ps_f16c(auVar16);
            auVar17._8_8_ = 0;
            auVar17._0_8_ = *(ulong *)(*pauVar54 + lVar46);
            auVar263 = vcvtph2ps_f16c(auVar17);
            auVar181 = *(undefined1 (*) [16])(*pauVar38 + lVar46 * 2);
            auVar18._8_8_ = 0;
            auVar18._0_8_ = *(ulong *)(*pauVar56 + lVar46);
            auVar284 = vcvtph2ps_f16c(auVar18);
            local_288 = vfmadd231ps_fma(local_288,auVar181,auVar217);
            local_348 = vfmadd231ps_fma(local_348,auVar181,auVar93);
            local_338 = vfmadd231ps_fma(auVar213._0_16_,auVar181,auVar263);
            auVar213 = ZEXT1664(local_338);
            local_328 = vfmadd231ps_fma(auVar122._0_16_,auVar181,auVar284);
            auVar122 = ZEXT1664(local_328);
            pauVar50 = (undefined1 (*) [32])(*pauVar50 + 0x10);
            uVar32 = uVar57 + 4;
            lVar46 = lVar46 + 8;
            iVar36 = uVar57 + 7;
            uVar57 = uVar32;
          } while (iVar36 < (int)uVar39);
          pauVar44 = (undefined1 (*) [16])(*pauVar44 + lVar46);
          pauVar63 = (undefined1 (*) [16])(*pauVar63 + lVar46);
          pauVar54 = (undefined1 (*) [16])(*pauVar54 + lVar46);
          pauVar56 = (undefined1 (*) [16])(*pauVar56 + lVar46);
          pauVar38 = pauVar50;
        }
        else {
          local_348 = ZEXT816(0);
          local_338 = SUB6416(ZEXT864(0),0);
          local_328 = SUB6416(ZEXT864(0),0);
        }
        local_268 = (ulong)(uVar39 - uVar32);
        local_278 = fVar87;
        if (uVar39 - uVar32 != 0 && (int)uVar32 <= (int)uVar39) {
          lVar46 = 0;
          do {
            local_2a8._0_16_ = auVar125;
            uVar32 = *(uint *)(*pauVar38 + lVar46 * 4);
            fVar87 = float16_to_float32(*(unsigned_short *)(*pauVar44 + lVar46 * 2));
            auVar155 = local_218;
            local_218._4_4_ = extraout_XMM0_Db_04;
            local_218._0_4_ = fVar87;
            local_218._8_4_ = extraout_XMM0_Dc_03;
            local_218._16_16_ = auVar155._16_16_;
            local_218._12_4_ = extraout_XMM0_Dd_03;
            local_308 = ZEXT416(*(uint *)(*pauVar38 + lVar46 * 4));
            local_318 = float16_to_float32(*(unsigned_short *)(*pauVar63 + lVar46 * 2));
            local_238 = ZEXT416(*(uint *)(*pauVar38 + lVar46 * 4));
            local_248 = float16_to_float32(*(unsigned_short *)(*pauVar54 + lVar46 * 2));
            local_258 = ZEXT416(*(uint *)(*pauVar38 + lVar46 * 4));
            auVar213._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar56 + lVar46 * 2));
            auVar213._4_60_ = extraout_var_00;
            auVar125 = vinsertps_avx(local_218._0_16_,ZEXT416((uint)local_318),0x10);
            auVar125 = vinsertps_avx(auVar125,ZEXT416((uint)local_248),0x20);
            auVar125 = vinsertps_avx(auVar125,auVar213._0_16_,0x30);
            auVar181 = vinsertps_avx(ZEXT416(uVar32),ZEXT416((uint)local_308._0_4_),0x10);
            auVar181 = vinsertps_avx(auVar181,ZEXT416((uint)local_238._0_4_),0x20);
            auVar181 = vinsertps_avx(auVar181,ZEXT416((uint)local_258._0_4_),0x30);
            auVar125 = vfmadd231ps_fma(local_2a8._0_16_,auVar125,auVar181);
            lVar46 = lVar46 + 1;
          } while ((uint)local_268 != (int)lVar46);
        }
        auVar155 = vhaddps_avx(local_1b8,local_1f8);
        auVar83 = vhaddps_avx(local_1d8,local_198);
        auVar155 = vhaddps_avx(auVar155,auVar83);
        auVar217 = vunpcklps_avx(local_288,local_348);
        auVar93 = vunpcklps_avx(local_338,local_328);
        auVar263 = vunpckhps_avx(local_288,local_348);
        auVar284 = vunpckhps_avx(local_338,local_328);
        auVar181 = vmovlhps_avx(auVar217,auVar93);
        auVar93 = vunpckhpd_avx(auVar217,auVar93);
        auVar217 = vmovlhps_avx(auVar263,auVar284);
        auVar263 = vunpckhpd_avx(auVar263,auVar284);
        auVar73._0_4_ =
             auVar93._0_4_ + auVar181._0_4_ + auVar217._0_4_ + auVar263._0_4_ +
             auVar125._0_4_ + auVar155._0_4_ + auVar155._16_4_;
        auVar73._4_4_ =
             auVar93._4_4_ + auVar181._4_4_ + auVar217._4_4_ + auVar263._4_4_ +
             auVar125._4_4_ + auVar155._4_4_ + auVar155._20_4_;
        auVar73._8_4_ =
             auVar93._8_4_ + auVar181._8_4_ + auVar217._8_4_ + auVar263._8_4_ +
             auVar125._8_4_ + auVar155._8_4_ + auVar155._24_4_;
        auVar73._12_4_ =
             auVar93._12_4_ + auVar181._12_4_ + auVar217._12_4_ + auVar263._12_4_ +
             auVar125._12_4_ + auVar155._12_4_ + auVar155._28_4_;
        switch(iVar42) {
        case 1:
          auVar73 = vmaxps_avx(auVar73,ZEXT816(0) << 0x20);
          break;
        case 2:
          auVar125 = vmaxps_avx(auVar73,ZEXT816(0) << 0x20);
          auVar181 = vminps_avx(auVar73,ZEXT816(0) << 0x20);
          uVar20 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var22);
          auVar77._4_4_ = uVar20;
          auVar77._0_4_ = uVar20;
          auVar77._8_4_ = uVar20;
          auVar77._12_4_ = uVar20;
          auVar73 = vfmadd213ps_fma(auVar77,auVar181,auVar125);
          break;
        case 3:
          uVar20 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var22);
          auVar97._4_4_ = uVar20;
          auVar97._0_4_ = uVar20;
          auVar97._8_4_ = uVar20;
          auVar97._12_4_ = uVar20;
          uVar20 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var22))[1];
          auVar147._4_4_ = uVar20;
          auVar147._0_4_ = uVar20;
          auVar147._8_4_ = uVar20;
          auVar147._12_4_ = uVar20;
          auVar125 = vmaxps_avx(auVar73,auVar97);
          auVar73 = vminps_avx(auVar125,auVar147);
          break;
        case 4:
          uVar31 = CONCAT44(auVar73._4_4_,auVar73._0_4_);
          auVar74._0_8_ = uVar31 ^ 0x8000000080000000;
          auVar74._8_4_ = -auVar73._8_4_;
          auVar74._12_4_ = -auVar73._12_4_;
          auVar98._8_4_ = 0x42b0c0a5;
          auVar98._0_8_ = 0x42b0c0a542b0c0a5;
          auVar98._12_4_ = 0x42b0c0a5;
          auVar125 = vminps_avx(auVar74,auVar98);
          auVar99._8_4_ = 0xc2b0c0a5;
          auVar99._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar99._12_4_ = 0xc2b0c0a5;
          auVar217 = vmaxps_avx(auVar125,auVar99);
          auVar100._8_4_ = 0x3fb8aa3b;
          auVar100._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar100._12_4_ = 0x3fb8aa3b;
          auVar148._8_4_ = 0x3f000000;
          auVar148._0_8_ = 0x3f0000003f000000;
          auVar148._12_4_ = 0x3f000000;
          auVar125 = vfmadd213ps_fma(auVar100,auVar217,auVar148);
          auVar196._0_4_ = (int)auVar125._0_4_;
          auVar196._4_4_ = (int)auVar125._4_4_;
          auVar196._8_4_ = (int)auVar125._8_4_;
          auVar196._12_4_ = (int)auVar125._12_4_;
          auVar181 = vcvtdq2ps_avx(auVar196);
          auVar125 = vcmpps_avx(auVar125,auVar181,1);
          auVar101._8_4_ = 0x3f800000;
          auVar101._0_8_ = 0x3f8000003f800000;
          auVar101._12_4_ = 0x3f800000;
          auVar125 = vandps_avx(auVar125,auVar101);
          auVar125 = vsubps_avx(auVar181,auVar125);
          auVar235._8_4_ = 0x3f318000;
          auVar235._0_8_ = 0x3f3180003f318000;
          auVar235._12_4_ = 0x3f318000;
          auVar181 = vfmsub213ps_fma(auVar235,auVar125,auVar217);
          auVar75._8_4_ = 0x395e8083;
          auVar75._0_8_ = 0x395e8083395e8083;
          auVar75._12_4_ = 0x395e8083;
          auVar217 = vfmsub213ps_fma(auVar75,auVar125,auVar181);
          auVar236._0_4_ = auVar217._0_4_ * auVar217._0_4_;
          auVar236._4_4_ = auVar217._4_4_ * auVar217._4_4_;
          auVar236._8_4_ = auVar217._8_4_ * auVar217._8_4_;
          auVar236._12_4_ = auVar217._12_4_ * auVar217._12_4_;
          auVar246._8_4_ = 0x3ab743ce;
          auVar246._0_8_ = 0x3ab743ce3ab743ce;
          auVar246._12_4_ = 0x3ab743ce;
          auVar265._8_4_ = 0x39506967;
          auVar265._0_8_ = 0x3950696739506967;
          auVar265._12_4_ = 0x39506967;
          auVar181 = vfmadd213ps_fma(auVar265,auVar217,auVar246);
          auVar247._8_4_ = 0x3c088908;
          auVar247._0_8_ = 0x3c0889083c088908;
          auVar247._12_4_ = 0x3c088908;
          auVar181 = vfmadd231ps_fma(auVar247,auVar217,auVar181);
          auVar266._8_4_ = 0x3d2aa9c1;
          auVar266._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar266._12_4_ = 0x3d2aa9c1;
          auVar181 = vfmadd231ps_fma(auVar266,auVar217,auVar181);
          auVar248._8_4_ = 0x3e2aaaaa;
          auVar248._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar248._12_4_ = 0x3e2aaaaa;
          auVar181 = vfmadd231ps_fma(auVar248,auVar217,auVar181);
          auVar181 = vfmadd213ps_fma(auVar181,auVar217,auVar148);
          auVar181 = vfmadd213ps_fma(auVar181,auVar236,auVar217);
          auVar149._0_4_ = auVar181._0_4_ + 1.0;
          auVar149._4_4_ = auVar181._4_4_ + 1.0;
          auVar149._8_4_ = auVar181._8_4_ + 1.0;
          auVar149._12_4_ = auVar181._12_4_ + 1.0;
          auVar76._0_4_ = (int)auVar125._0_4_;
          auVar76._4_4_ = (int)auVar125._4_4_;
          auVar76._8_4_ = (int)auVar125._8_4_;
          auVar76._12_4_ = (int)auVar125._12_4_;
          auVar125 = vpslld_avx(auVar76,0x17);
          auVar125 = vpaddd_avx(auVar125,auVar101);
          auVar181 = vfmadd213ps_fma(auVar125,auVar149,auVar101);
          auVar125 = vrcpps_avx(auVar181);
          auVar181 = vfmsub213ps_fma(auVar181,auVar125,auVar101);
          auVar73 = vfnmadd132ps_fma(auVar181,auVar125,auVar125);
          break;
        case 5:
          auVar94._8_4_ = 0x42b0c0a5;
          auVar94._0_8_ = 0x42b0c0a542b0c0a5;
          auVar94._12_4_ = 0x42b0c0a5;
          auVar125 = vminps_avx(auVar73,auVar94);
          auVar135._8_4_ = 0xc2b0c0a5;
          auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar135._12_4_ = 0xc2b0c0a5;
          auVar217 = vmaxps_avx(auVar125,auVar135);
          auVar245._8_4_ = 0x3fb8aa3b;
          auVar245._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar245._12_4_ = 0x3fb8aa3b;
          auVar285._8_4_ = 0x3f000000;
          auVar285._0_8_ = 0x3f0000003f000000;
          auVar285._12_4_ = 0x3f000000;
          auVar125 = vfmadd213ps_fma(auVar245,auVar217,auVar285);
          auVar193._0_4_ = (int)auVar125._0_4_;
          auVar193._4_4_ = (int)auVar125._4_4_;
          auVar193._8_4_ = (int)auVar125._8_4_;
          auVar193._12_4_ = (int)auVar125._12_4_;
          auVar181 = vcvtdq2ps_avx(auVar193);
          auVar125 = vcmpps_avx(auVar125,auVar181,1);
          auVar264._8_4_ = 0x3f800000;
          auVar264._0_8_ = 0x3f8000003f800000;
          auVar264._12_4_ = 0x3f800000;
          auVar125 = vandps_avx(auVar125,auVar264);
          auVar125 = vsubps_avx(auVar181,auVar125);
          auVar194._8_4_ = 0x3f318000;
          auVar194._0_8_ = 0x3f3180003f318000;
          auVar194._12_4_ = 0x3f318000;
          auVar181 = vfmsub231ps_fma(auVar217,auVar125,auVar194);
          auVar298._8_4_ = 0xb95e8083;
          auVar298._0_8_ = 0xb95e8083b95e8083;
          auVar298._12_4_ = 0xb95e8083;
          auVar217 = vfnmsub231ps_fma(auVar181,auVar125,auVar298);
          auVar373._0_4_ = auVar217._0_4_ * auVar217._0_4_;
          auVar373._4_4_ = auVar217._4_4_ * auVar217._4_4_;
          auVar373._8_4_ = auVar217._8_4_ * auVar217._8_4_;
          auVar373._12_4_ = auVar217._12_4_ * auVar217._12_4_;
          auVar136._8_4_ = 0x3ab743ce;
          auVar136._0_8_ = 0x3ab743ce3ab743ce;
          auVar136._12_4_ = 0x3ab743ce;
          auVar95._8_4_ = 0x39506967;
          auVar95._0_8_ = 0x3950696739506967;
          auVar95._12_4_ = 0x39506967;
          auVar181 = vfmadd213ps_fma(auVar95,auVar217,auVar136);
          auVar325._8_4_ = 0x3c088908;
          auVar325._0_8_ = 0x3c0889083c088908;
          auVar325._12_4_ = 0x3c088908;
          auVar181 = vfmadd213ps_fma(auVar181,auVar217,auVar325);
          auVar347._8_4_ = 0x3d2aa9c1;
          auVar347._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar347._12_4_ = 0x3d2aa9c1;
          auVar181 = vfmadd213ps_fma(auVar181,auVar217,auVar347);
          auVar354._8_4_ = 0x3e2aaaaa;
          auVar354._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar354._12_4_ = 0x3e2aaaaa;
          auVar181 = vfmadd213ps_fma(auVar181,auVar217,auVar354);
          auVar181 = vfmadd213ps_fma(auVar181,auVar217,auVar285);
          auVar181 = vfmadd213ps_fma(auVar181,auVar373,auVar217);
          auVar223._0_4_ = auVar181._0_4_ + 1.0;
          auVar223._4_4_ = auVar181._4_4_ + 1.0;
          auVar223._8_4_ = auVar181._8_4_ + 1.0;
          auVar223._12_4_ = auVar181._12_4_ + 1.0;
          auVar365._0_4_ = (int)auVar125._0_4_;
          auVar365._4_4_ = (int)auVar125._4_4_;
          auVar365._8_4_ = (int)auVar125._8_4_;
          auVar365._12_4_ = (int)auVar125._12_4_;
          auVar125 = vpslld_avx(auVar365,0x17);
          auVar125 = vpaddd_avx(auVar125,auVar264);
          auVar125 = vfmadd213ps_fma(auVar125,auVar223,auVar264);
          auVar181 = vcmpps_avx(auVar125,ZEXT816(0) << 0x40,2);
          auVar224._8_4_ = 0x800000;
          auVar224._0_8_ = 0x80000000800000;
          auVar224._12_4_ = 0x800000;
          auVar125 = vmaxps_avx(auVar125,auVar224);
          auVar217 = vpsrld_avx(auVar125,0x17);
          auVar374._8_4_ = 0x807fffff;
          auVar374._0_8_ = 0x807fffff807fffff;
          auVar374._12_4_ = 0x807fffff;
          auVar125 = vandps_avx(auVar374,auVar125);
          auVar93 = vorps_avx(auVar125,auVar285);
          auVar375._8_4_ = 0xffffff82;
          auVar375._0_8_ = 0xffffff82ffffff82;
          auVar375._12_4_ = 0xffffff82;
          auVar263 = vpaddd_avx(auVar217,auVar375);
          auVar366._8_4_ = 0x3f3504f3;
          auVar366._0_8_ = 0x3f3504f33f3504f3;
          auVar366._12_4_ = 0x3f3504f3;
          auVar217 = vcmpps_avx(auVar93,auVar366,1);
          auVar125 = vandps_avx(auVar217,auVar93);
          auVar367._0_4_ = auVar93._0_4_ + -1.0 + auVar125._0_4_;
          auVar367._4_4_ = auVar93._4_4_ + -1.0 + auVar125._4_4_;
          auVar367._8_4_ = auVar93._8_4_ + -1.0 + auVar125._8_4_;
          auVar367._12_4_ = auVar93._12_4_ + -1.0 + auVar125._12_4_;
          auVar93 = vcvtdq2ps_avx(auVar263);
          auVar125 = vandps_avx(auVar217,auVar264);
          auVar125 = vsubps_avx(auVar93,auVar125);
          auVar137._8_4_ = 0xbdebd1b8;
          auVar137._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar137._12_4_ = 0xbdebd1b8;
          auVar225._8_4_ = 0x3d9021bb;
          auVar225._0_8_ = 0x3d9021bb3d9021bb;
          auVar225._12_4_ = 0x3d9021bb;
          auVar217 = vfmadd213ps_fma(auVar225,auVar367,auVar137);
          auVar138._8_4_ = 0x3def251a;
          auVar138._0_8_ = 0x3def251a3def251a;
          auVar138._12_4_ = 0x3def251a;
          auVar217 = vfmadd231ps_fma(auVar138,auVar367,auVar217);
          auVar226._8_4_ = 0xbdfe5d4f;
          auVar226._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar226._12_4_ = 0xbdfe5d4f;
          auVar217 = vfmadd231ps_fma(auVar226,auVar367,auVar217);
          auVar139._8_4_ = 0x3e11e9bf;
          auVar139._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar139._12_4_ = 0x3e11e9bf;
          auVar217 = vfmadd231ps_fma(auVar139,auVar367,auVar217);
          auVar227._8_4_ = 0xbe2aae50;
          auVar227._0_8_ = 0xbe2aae50be2aae50;
          auVar227._12_4_ = 0xbe2aae50;
          auVar217 = vfmadd231ps_fma(auVar227,auVar367,auVar217);
          auVar140._8_4_ = 0x3e4cceac;
          auVar140._0_8_ = 0x3e4cceac3e4cceac;
          auVar140._12_4_ = 0x3e4cceac;
          auVar217 = vfmadd231ps_fma(auVar140,auVar367,auVar217);
          auVar228._8_4_ = 0xbe7ffffc;
          auVar228._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar228._12_4_ = 0xbe7ffffc;
          auVar217 = vfmadd231ps_fma(auVar228,auVar367,auVar217);
          auVar141._8_4_ = 0x3eaaaaaa;
          auVar141._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar141._12_4_ = 0x3eaaaaaa;
          auVar217 = vfmadd231ps_fma(auVar141,auVar367,auVar217);
          auVar229._0_4_ = auVar367._0_4_ * auVar367._0_4_;
          auVar229._4_4_ = auVar367._4_4_ * auVar367._4_4_;
          auVar229._8_4_ = auVar367._8_4_ * auVar367._8_4_;
          auVar229._12_4_ = auVar367._12_4_ * auVar367._12_4_;
          auVar142._0_4_ = auVar367._0_4_ * auVar229._0_4_ * auVar217._0_4_;
          auVar142._4_4_ = auVar367._4_4_ * auVar229._4_4_ * auVar217._4_4_;
          auVar142._8_4_ = auVar367._8_4_ * auVar229._8_4_ * auVar217._8_4_;
          auVar142._12_4_ = auVar367._12_4_ * auVar229._12_4_ * auVar217._12_4_;
          auVar217 = vfmadd231ps_fma(auVar142,auVar125,auVar298);
          auVar217 = vfmsub231ps_fma(auVar217,auVar285,auVar229);
          auVar217 = vsubps_avx(auVar217,auVar367);
          auVar125 = vfnmadd231ps_fma(auVar217,auVar194,auVar125);
          auVar143._0_4_ = auVar125._0_4_ + auVar125._0_4_;
          auVar143._4_4_ = auVar125._4_4_ + auVar125._4_4_;
          auVar143._8_4_ = auVar125._8_4_ + auVar125._8_4_;
          auVar143._12_4_ = auVar125._12_4_ + auVar125._12_4_;
          auVar230._8_4_ = 0x7fffffff;
          auVar230._0_8_ = 0x7fffffff7fffffff;
          auVar230._12_4_ = 0x7fffffff;
          auVar125 = vblendvps_avx(auVar143,auVar230,auVar181);
          auVar231._8_4_ = 0x42b0c0a5;
          auVar231._0_8_ = 0x42b0c0a542b0c0a5;
          auVar231._12_4_ = 0x42b0c0a5;
          auVar125 = vminps_avx(auVar125,auVar231);
          auVar232._8_4_ = 0xc2b0c0a5;
          auVar232._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar232._12_4_ = 0xc2b0c0a5;
          auVar217 = vmaxps_avx(auVar125,auVar232);
          auVar125 = vfmadd213ps_fma(auVar245,auVar217,auVar285);
          auVar233._0_4_ = (int)auVar125._0_4_;
          auVar233._4_4_ = (int)auVar125._4_4_;
          auVar233._8_4_ = (int)auVar125._8_4_;
          auVar233._12_4_ = (int)auVar125._12_4_;
          auVar181 = vcvtdq2ps_avx(auVar233);
          auVar125 = vcmpps_avx(auVar125,auVar181,1);
          auVar125 = vandps_avx(auVar125,auVar264);
          auVar125 = vsubps_avx(auVar181,auVar125);
          auVar181 = vfmsub213ps_fma(auVar194,auVar125,auVar217);
          auVar217 = vfnmsub231ps_fma(auVar181,auVar125,auVar298);
          auVar144._8_4_ = 0x3ab743ce;
          auVar144._0_8_ = 0x3ab743ce3ab743ce;
          auVar144._12_4_ = 0x3ab743ce;
          auVar181 = vfmadd213ps_fma(auVar95,auVar217,auVar144);
          auVar181 = vfmadd213ps_fma(auVar181,auVar217,auVar325);
          auVar181 = vfmadd213ps_fma(auVar181,auVar217,auVar347);
          auVar181 = vfmadd213ps_fma(auVar181,auVar217,auVar354);
          auVar181 = vfmadd213ps_fma(auVar181,auVar217,auVar285);
          auVar145._0_4_ = auVar217._0_4_ * auVar217._0_4_;
          auVar145._4_4_ = auVar217._4_4_ * auVar217._4_4_;
          auVar145._8_4_ = auVar217._8_4_ * auVar217._8_4_;
          auVar145._12_4_ = auVar217._12_4_ * auVar217._12_4_;
          auVar181 = vfmadd213ps_fma(auVar181,auVar145,auVar217);
          auVar96._0_4_ = auVar181._0_4_ + 1.0;
          auVar96._4_4_ = auVar181._4_4_ + 1.0;
          auVar96._8_4_ = auVar181._8_4_ + 1.0;
          auVar96._12_4_ = auVar181._12_4_ + 1.0;
          auVar146._0_4_ = (int)auVar125._0_4_;
          auVar146._4_4_ = (int)auVar125._4_4_;
          auVar146._8_4_ = (int)auVar125._8_4_;
          auVar146._12_4_ = (int)auVar125._12_4_;
          auVar125 = vpslld_avx(auVar146,0x17);
          auVar125 = vpaddd_avx(auVar125,auVar264);
          auVar181 = vfmadd213ps_fma(auVar125,auVar96,auVar264);
          auVar125 = vrcpps_avx(auVar181);
          auVar195._0_4_ = auVar125._0_4_ + auVar125._0_4_;
          auVar195._4_4_ = auVar125._4_4_ + auVar125._4_4_;
          auVar195._8_4_ = auVar125._8_4_ + auVar125._8_4_;
          auVar195._12_4_ = auVar125._12_4_ + auVar125._12_4_;
          auVar234._8_4_ = 0x40000000;
          auVar234._0_8_ = 0x4000000040000000;
          auVar234._12_4_ = 0x40000000;
          auVar181 = vfmsub231ps_fma(auVar234,auVar195,auVar181);
          auVar125 = vfnmadd213ps_fma(auVar181,auVar125,auVar195);
          auVar73 = vfmsub231ps_fma(auVar73,auVar73,auVar125);
          break;
        case 6:
          uVar20 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var22);
          auVar102._4_4_ = uVar20;
          auVar102._0_4_ = uVar20;
          auVar102._8_4_ = uVar20;
          auVar102._12_4_ = uVar20;
          uVar20 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var22))[1];
          auVar150._4_4_ = uVar20;
          auVar150._0_4_ = uVar20;
          auVar150._8_4_ = uVar20;
          auVar150._12_4_ = uVar20;
          auVar125 = vfmadd231ps_fma(auVar150,auVar73,auVar102);
          auVar125 = vmaxps_avx(auVar125,ZEXT416(0) << 0x20);
          auVar151._8_4_ = 0x3f800000;
          auVar151._0_8_ = 0x3f8000003f800000;
          auVar151._12_4_ = 0x3f800000;
          auVar125 = vminps_avx(auVar125,auVar151);
          auVar73._0_4_ = auVar125._0_4_ * auVar73._0_4_;
          auVar73._4_4_ = auVar125._4_4_ * auVar73._4_4_;
          auVar73._8_4_ = auVar125._8_4_ * auVar73._8_4_;
          auVar73._12_4_ = auVar125._12_4_ * auVar73._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar41 * 4) = auVar73;
        fVar87 = local_278;
      }
      iVar33 = (int)uVar41 + (int)fVar87 * 4;
      iVar36 = 0;
      if (iVar33 < iVar21) {
        local_318 = (float)(uVar39 & 0xfffffff8);
        uVar41 = (ulong)iVar33;
        do {
          auVar122 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar61 != 0) {
            auVar122 = ZEXT464(*(uint *)(lVar61 + uVar41 * 4));
          }
          fVar87 = auVar122._0_4_;
          pauVar44 = (undefined1 (*) [16])
                     ((long)(this->weight_data_tm).w * uVar41 * (this->weight_data_tm).elemsize +
                     (long)(this->weight_data_tm).data);
          pauVar38 = local_398;
          if ((int)uVar39 < 8) {
            auVar125 = ZEXT816(0);
            fVar123 = 0.0;
          }
          else {
            auVar125 = ZEXT816(0);
            iVar36 = 7;
            do {
              auVar181 = vlddqu_avx(*pauVar44);
              auVar155 = vcvtph2ps_f16c(auVar181);
              auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar155,*pauVar38);
              pauVar38 = pauVar38 + 1;
              pauVar44 = pauVar44 + 1;
              iVar36 = iVar36 + 8;
              fVar123 = local_318;
            } while (iVar36 < (int)uVar39);
          }
          local_218 = ZEXT1632(auVar125);
          local_308 = ZEXT816(0) << 0x40;
          uVar32 = (uint)fVar123 | 3;
          while ((int)uVar32 < (int)uVar39) {
            auVar19._8_8_ = 0;
            auVar19._0_8_ = *(ulong *)*pauVar44;
            auVar125 = vcvtph2ps_f16c(auVar19);
            local_308 = vfmadd231ps_fma(local_308,auVar125,*(undefined1 (*) [16])*pauVar38);
            pauVar38 = (undefined1 (*) [32])(*pauVar38 + 0x10);
            pauVar44 = (undefined1 (*) [16])(*pauVar44 + 8);
            uVar32 = (int)fVar123 + 7;
            fVar123 = (float)((int)fVar123 + 4);
          }
          if ((int)fVar123 < (int)uVar39) {
            lVar46 = 0;
            do {
              local_2a8._0_4_ = auVar122._0_4_;
              uVar32 = *(uint *)(*pauVar38 + lVar46 * 4);
              auVar315._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar44 + lVar46 * 2));
              auVar315._4_60_ = extraout_var_01;
              auVar125 = vfmadd231ss_fma(ZEXT416((uint)local_2a8._0_4_),auVar315._0_16_,
                                         ZEXT416(uVar32));
              fVar87 = auVar125._0_4_;
              auVar122 = ZEXT1664(auVar125);
              lVar46 = lVar46 + 1;
            } while (uVar39 - (int)fVar123 != (int)lVar46);
          }
          auVar125 = vshufpd_avx(local_308,local_308,1);
          auVar103._0_4_ = auVar125._0_4_ + local_308._0_4_;
          auVar103._4_4_ = auVar125._4_4_ + local_308._4_4_;
          auVar103._8_4_ = auVar125._8_4_ + local_308._8_4_;
          auVar103._12_4_ = auVar125._12_4_ + local_308._12_4_;
          auVar125 = vhaddps_avx(local_218._16_16_,local_218._0_16_);
          auVar181 = vmovshdup_avx(auVar103);
          auVar125 = vhaddps_avx(auVar125,auVar125);
          auVar125 = vhaddps_avx(auVar125,auVar125);
          fVar87 = auVar125._0_4_ + auVar181._0_4_ + auVar103._0_4_ + fVar87;
          auVar125 = ZEXT416((uint)fVar87);
          fVar123 = fVar87;
          if (iVar42 - 1U < 6) {
            switch(iVar42) {
            case 1:
              auVar125 = vmaxss_avx(ZEXT416((uint)fVar87),ZEXT416(0));
              fVar123 = auVar125._0_4_;
              break;
            case 2:
              auVar78._0_12_ = ZEXT812(0);
              auVar78._12_4_ = 0;
              auVar125 = vcmpss_avx(auVar78,ZEXT416((uint)fVar87),1);
              auVar153._8_4_ = 0x3f800000;
              auVar153._0_8_ = 0x3f8000003f800000;
              auVar153._12_4_ = 0x3f800000;
              auVar125 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var22)),
                                       auVar153,auVar125);
              fVar123 = auVar125._0_4_ * fVar87;
              break;
            case 3:
              fVar87 = (float)(*(uint **)(&this->field_0xe8 + (long)p_Var22))[1];
              auVar125 = vmaxss_avx(auVar125,ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var22))
                                   );
              fVar123 = auVar125._0_4_;
              if (fVar87 < auVar125._0_4_) {
                fVar123 = fVar87;
              }
              break;
            case 4:
              auVar125 = vminss_avx(auVar125,ZEXT416(0x42b0c0a5));
              auVar104._0_8_ = auVar125._0_8_ ^ 0x8000000080000000;
              auVar104._8_4_ = auVar125._8_4_ ^ 0x80000000;
              auVar104._12_4_ = auVar125._12_4_ ^ 0x80000000;
              auVar125 = vcmpss_avx(auVar125,ZEXT416(0xc2b0c0a5),1);
              auVar152._8_4_ = 0x42b0c0a5;
              auVar152._0_8_ = 0x42b0c0a542b0c0a5;
              auVar152._12_4_ = 0x42b0c0a5;
              auVar125 = vblendvps_avx(auVar104,auVar152,auVar125);
              fVar87 = expf(auVar125._0_4_);
              fVar123 = 1.0 / (fVar87 + 1.0);
              break;
            case 5:
              local_2a8._0_4_ = fVar87;
              fVar87 = expf(fVar87);
              fVar87 = logf(fVar87 + 1.0);
              fVar123 = tanhf(fVar87);
              fVar123 = fVar123 * (float)local_2a8._0_4_;
              break;
            case 6:
              fVar3 = **(float **)(&this->field_0xe8 + (long)p_Var22);
              fVar4 = (*(float **)(&this->field_0xe8 + (long)p_Var22))[1];
              fVar180 = -fVar4 / fVar3;
              fVar123 = 0.0;
              if ((fVar180 <= fVar87) && (fVar123 = fVar87, fVar87 <= fVar180 + 1.0 / fVar3)) {
                auVar125 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar125,ZEXT416((uint)fVar4));
                fVar123 = auVar125._0_4_ * fVar87;
              }
            }
          }
          *(float *)((long)top_blob->data + uVar41 * 4) = fVar123;
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar40);
        iVar36 = 0;
      }
    }
    else if (iVar42 == 4) {
      iVar36 = top_blob->w;
      if (0 < (long)iVar36) {
        p_Var22 = this->_vptr_InnerProduct_x86_fma[-3];
        uVar20 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var22);
        uVar39 = local_380 * iStack_36c;
        lVar61 = *(long *)(&this->field_0x178 + (long)p_Var22);
        lVar46 = 0;
        auVar122 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        do {
          auVar125 = ZEXT816(0) << 0x40;
          if (lVar61 != 0) {
            auVar125 = *(undefined1 (*) [16])(lVar61 + lVar46 * 0x10);
          }
          pauVar50 = (undefined1 (*) [32])
                     ((this->weight_data_tm).w * lVar46 * (this->weight_data_tm).elemsize +
                     (long)(this->weight_data_tm).data);
          pauVar38 = local_398;
          if ((int)uVar39 < 8) {
            auVar155 = SUB6432(ZEXT864(0),0);
            auVar83 = SUB6432(ZEXT864(0),0);
            auVar213 = ZEXT864(0);
            auVar315 = ZEXT864(0);
            uVar32 = 0;
          }
          else {
            auVar315 = ZEXT864(0);
            iVar42 = 7;
            auVar213 = ZEXT864(0);
            auVar179 = ZEXT864(0);
            auVar379 = ZEXT864(0);
            do {
              uVar1 = *(undefined4 *)*pauVar38;
              auVar239._4_4_ = uVar1;
              auVar239._0_4_ = uVar1;
              auVar239._8_4_ = uVar1;
              auVar239._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar38 + 4);
              auVar239._20_4_ = uVar1;
              auVar239._16_4_ = uVar1;
              auVar239._24_4_ = uVar1;
              auVar239._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar38 + 8);
              auVar312._4_4_ = uVar1;
              auVar312._0_4_ = uVar1;
              auVar312._8_4_ = uVar1;
              auVar312._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar38 + 0xc);
              auVar312._20_4_ = uVar1;
              auVar312._16_4_ = uVar1;
              auVar312._24_4_ = uVar1;
              auVar312._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar38 + 0x10);
              auVar350._4_4_ = uVar1;
              auVar350._0_4_ = uVar1;
              auVar350._8_4_ = uVar1;
              auVar350._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar38 + 0x14);
              auVar350._20_4_ = uVar1;
              auVar350._16_4_ = uVar1;
              auVar350._24_4_ = uVar1;
              auVar350._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar38 + 0x18);
              auVar357._4_4_ = uVar1;
              auVar357._0_4_ = uVar1;
              auVar357._8_4_ = uVar1;
              auVar357._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar38 + 0x1c);
              auVar357._20_4_ = uVar1;
              auVar357._16_4_ = uVar1;
              auVar357._24_4_ = uVar1;
              auVar357._28_4_ = uVar1;
              auVar155 = vlddqu_avx(*pauVar50);
              auVar111 = vlddqu_avx(pauVar50[1]);
              auVar83 = vcvtph2ps_f16c(auVar155._0_16_);
              auVar181 = vfmadd231ps_fma(auVar315._0_32_,auVar239,auVar83);
              auVar315 = ZEXT1664(auVar181);
              auVar155 = vcvtph2ps_f16c(auVar155._16_16_);
              auVar181 = vfmadd231ps_fma(auVar213._0_32_,auVar312,auVar155);
              auVar213 = ZEXT1664(auVar181);
              auVar155 = vcvtph2ps_f16c(auVar111._0_16_);
              auVar181 = vfmadd231ps_fma(auVar179._0_32_,auVar350,auVar155);
              auVar179 = ZEXT1664(auVar181);
              auVar83 = ZEXT1632(auVar181);
              auVar155 = vcvtph2ps_f16c(auVar111._16_16_);
              auVar181 = vfmadd231ps_fma(auVar379._0_32_,auVar357,auVar155);
              auVar379 = ZEXT1664(auVar181);
              auVar155 = ZEXT1632(auVar181);
              pauVar38 = pauVar38 + 1;
              pauVar50 = pauVar50 + 2;
              iVar42 = iVar42 + 8;
              uVar32 = uVar39 & 0xfffffff8;
            } while (iVar42 < (int)uVar39);
          }
          auVar81 = auVar315._0_32_;
          auVar111 = auVar213._0_32_;
          uVar57 = uVar32 | 3;
          while ((int)uVar57 < (int)uVar39) {
            uVar1 = *(undefined4 *)*pauVar38;
            auVar240._4_4_ = uVar1;
            auVar240._0_4_ = uVar1;
            auVar240._8_4_ = uVar1;
            auVar240._12_4_ = uVar1;
            uVar1 = *(undefined4 *)(*pauVar38 + 4);
            auVar240._20_4_ = uVar1;
            auVar240._16_4_ = uVar1;
            auVar240._24_4_ = uVar1;
            auVar240._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(*pauVar38 + 8);
            auVar313._4_4_ = uVar1;
            auVar313._0_4_ = uVar1;
            auVar313._8_4_ = uVar1;
            auVar313._12_4_ = uVar1;
            uVar1 = *(undefined4 *)(*pauVar38 + 0xc);
            auVar313._20_4_ = uVar1;
            auVar313._16_4_ = uVar1;
            auVar313._24_4_ = uVar1;
            auVar313._28_4_ = uVar1;
            auVar111 = vlddqu_avx(*pauVar50);
            auVar81 = vcvtph2ps_f16c(auVar111._0_16_);
            auVar181 = vfmadd231ps_fma(auVar315._0_32_,auVar240,auVar81);
            auVar315 = ZEXT1664(auVar181);
            auVar81 = ZEXT1632(auVar181);
            auVar111 = vcvtph2ps_f16c(auVar111._16_16_);
            auVar181 = vfmadd231ps_fma(auVar213._0_32_,auVar313,auVar111);
            auVar213 = ZEXT1664(auVar181);
            auVar111 = ZEXT1632(auVar181);
            pauVar38 = (undefined1 (*) [32])(*pauVar38 + 0x10);
            pauVar50 = pauVar50 + 1;
            uVar57 = uVar32 + 7;
            uVar32 = uVar32 + 4;
          }
          if (uVar39 - uVar32 != 0 && (int)uVar32 <= (int)uVar39) {
            lVar52 = 0;
            do {
              auVar15._8_8_ = 0;
              auVar15._0_8_ = *(ulong *)(*pauVar50 + lVar52 * 8);
              auVar181 = vcvtph2ps_f16c(auVar15);
              uVar1 = *(undefined4 *)(*pauVar38 + lVar52 * 4);
              auVar302._4_4_ = uVar1;
              auVar302._0_4_ = uVar1;
              auVar302._8_4_ = uVar1;
              auVar302._12_4_ = uVar1;
              auVar125 = vfmadd231ps_fma(auVar125,auVar302,auVar181);
              lVar52 = lVar52 + 1;
            } while (uVar39 - uVar32 != (int)lVar52);
          }
          fVar87 = auVar83._4_4_ + auVar155._4_4_ + auVar81._4_4_ + auVar111._4_4_;
          auVar89._0_4_ =
               auVar125._0_4_ +
               auVar83._16_4_ + auVar155._16_4_ + auVar81._16_4_ + auVar111._16_4_ +
               auVar83._0_4_ + auVar155._0_4_ + auVar81._0_4_ + auVar111._0_4_;
          auVar89._4_4_ = auVar125._4_4_ + fVar87 + fVar87;
          auVar89._8_4_ =
               auVar125._8_4_ +
               auVar83._24_4_ + auVar155._24_4_ + auVar81._24_4_ + auVar111._24_4_ +
               auVar83._8_4_ + auVar155._8_4_ + auVar81._8_4_ + auVar111._8_4_;
          auVar89._12_4_ =
               auVar125._12_4_ +
               auVar83._28_4_ + auVar155._28_4_ + auVar81._28_4_ + auVar111._28_4_ +
               auVar83._12_4_ + auVar155._12_4_ + auVar81._12_4_ + auVar111._12_4_;
          auVar125 = auVar122._0_16_;
          fVar87 = auVar122._0_4_;
          fVar123 = auVar122._4_4_;
          fVar3 = auVar122._8_4_;
          fVar4 = auVar122._12_4_;
          switch(uVar20) {
          case 1:
            auVar89 = vmaxps_avx(auVar89,_DAT_0054c060);
            break;
          case 2:
            auVar125 = vmaxps_avx(auVar89,ZEXT816(0) << 0x40);
            auVar181 = vminps_avx(auVar89,ZEXT816(0) << 0x40);
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var22);
            auVar92._4_4_ = uVar1;
            auVar92._0_4_ = uVar1;
            auVar92._8_4_ = uVar1;
            auVar92._12_4_ = uVar1;
            auVar89 = vfmadd213ps_fma(auVar92,auVar181,auVar125);
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var22);
            auVar129._4_4_ = uVar1;
            auVar129._0_4_ = uVar1;
            auVar129._8_4_ = uVar1;
            auVar129._12_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var22))[1];
            auVar187._4_4_ = uVar1;
            auVar187._0_4_ = uVar1;
            auVar187._8_4_ = uVar1;
            auVar187._12_4_ = uVar1;
            auVar125 = vmaxps_avx(auVar89,auVar129);
            auVar89 = vminps_avx(auVar125,auVar187);
            break;
          case 4:
            uVar40 = CONCAT44(auVar89._4_4_,auVar89._0_4_);
            auVar90._0_8_ = uVar40 ^ 0x8000000080000000;
            auVar90._8_4_ = -auVar89._8_4_;
            auVar90._12_4_ = -auVar89._12_4_;
            auVar130._8_4_ = 0x42b0c0a5;
            auVar130._0_8_ = 0x42b0c0a542b0c0a5;
            auVar130._12_4_ = 0x42b0c0a5;
            auVar181 = vminps_avx(auVar90,auVar130);
            auVar131._8_4_ = 0xc2b0c0a5;
            auVar131._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar131._12_4_ = 0xc2b0c0a5;
            auVar93 = vmaxps_avx(auVar181,auVar131);
            auVar132._8_4_ = 0x3fb8aa3b;
            auVar132._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar132._12_4_ = 0x3fb8aa3b;
            auVar244._8_4_ = 0x3f000000;
            auVar244._0_8_ = 0x3f0000003f000000;
            auVar244._12_4_ = 0x3f000000;
            auVar181 = vfmadd213ps_fma(auVar132,auVar93,auVar244);
            auVar188._0_4_ = (int)auVar181._0_4_;
            auVar188._4_4_ = (int)auVar181._4_4_;
            auVar188._8_4_ = (int)auVar181._8_4_;
            auVar188._12_4_ = (int)auVar181._12_4_;
            auVar217 = vcvtdq2ps_avx(auVar188);
            auVar181 = vcmpps_avx(auVar181,auVar217,1);
            auVar181 = vandps_avx(auVar181,auVar125);
            auVar181 = vsubps_avx(auVar217,auVar181);
            auVar69._8_4_ = 0x3f318000;
            auVar69._0_8_ = 0x3f3180003f318000;
            auVar69._12_4_ = 0x3f318000;
            auVar217 = vfmsub231ps_fma(auVar93,auVar181,auVar69);
            auVar189._8_4_ = 0x395e8083;
            auVar189._0_8_ = 0x395e8083395e8083;
            auVar189._12_4_ = 0x395e8083;
            auVar93 = vfmsub231ps_fma(auVar217,auVar181,auVar189);
            auVar190._0_4_ = auVar93._0_4_ * auVar93._0_4_;
            auVar190._4_4_ = auVar93._4_4_ * auVar93._4_4_;
            auVar190._8_4_ = auVar93._8_4_ * auVar93._8_4_;
            auVar190._12_4_ = auVar93._12_4_ * auVar93._12_4_;
            auVar222._8_4_ = 0x39506967;
            auVar222._0_8_ = 0x3950696739506967;
            auVar222._12_4_ = 0x39506967;
            auVar297._8_4_ = 0x3ab743ce;
            auVar297._0_8_ = 0x3ab743ce3ab743ce;
            auVar297._12_4_ = 0x3ab743ce;
            auVar217 = vfmadd213ps_fma(auVar222,auVar93,auVar297);
            auVar283._8_4_ = 0x3c088908;
            auVar283._0_8_ = 0x3c0889083c088908;
            auVar283._12_4_ = 0x3c088908;
            auVar217 = vfmadd213ps_fma(auVar217,auVar93,auVar283);
            auVar70._8_4_ = 0x3d2aa9c1;
            auVar70._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar70._12_4_ = 0x3d2aa9c1;
            auVar217 = vfmadd213ps_fma(auVar217,auVar93,auVar70);
            auVar71._8_4_ = 0x3e2aaaaa;
            auVar71._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar71._12_4_ = 0x3e2aaaaa;
            auVar217 = vfmadd213ps_fma(auVar217,auVar93,auVar71);
            auVar217 = vfmadd213ps_fma(auVar217,auVar93,auVar244);
            auVar217 = vfmadd213ps_fma(auVar217,auVar190,auVar93);
            auVar191._0_4_ = auVar217._0_4_ + fVar87;
            auVar191._4_4_ = auVar217._4_4_ + fVar123;
            auVar191._8_4_ = auVar217._8_4_ + fVar3;
            auVar191._12_4_ = auVar217._12_4_ + fVar4;
            auVar91._0_4_ = (int)auVar181._0_4_;
            auVar91._4_4_ = (int)auVar181._4_4_;
            auVar91._8_4_ = (int)auVar181._8_4_;
            auVar91._12_4_ = (int)auVar181._12_4_;
            auVar181 = vpslld_avx(auVar91,0x17);
            auVar181 = vpaddd_avx(auVar181,auVar125);
            auVar217 = vfmadd213ps_fma(auVar181,auVar191,auVar125);
            auVar181 = vrcpps_avx(auVar217);
            auVar125 = vfmsub213ps_fma(auVar217,auVar181,auVar125);
            auVar89 = vfnmadd132ps_fma(auVar125,auVar181,auVar181);
            break;
          case 5:
            auVar345._8_4_ = 0x42b0c0a5;
            auVar345._0_8_ = 0x42b0c0a542b0c0a5;
            auVar345._12_4_ = 0x42b0c0a5;
            auVar181 = vminps_avx(auVar345,auVar89);
            auVar353._8_4_ = 0xc2b0c0a5;
            auVar353._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar353._12_4_ = 0xc2b0c0a5;
            auVar93 = vmaxps_avx(auVar353,auVar181);
            auVar360._8_4_ = 0x3fb8aa3b;
            auVar360._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar360._12_4_ = 0x3fb8aa3b;
            auVar243._8_4_ = 0x3f000000;
            auVar243._0_8_ = 0x3f0000003f000000;
            auVar243._12_4_ = 0x3f000000;
            auVar181 = vfmadd213ps_fma(auVar360,auVar93,auVar243);
            auVar214._0_4_ = (int)auVar181._0_4_;
            auVar214._4_4_ = (int)auVar181._4_4_;
            auVar214._8_4_ = (int)auVar181._8_4_;
            auVar214._12_4_ = (int)auVar181._12_4_;
            auVar217 = vcvtdq2ps_avx(auVar214);
            auVar181 = vcmpps_avx(auVar181,auVar217,1);
            auVar181 = vandps_avx(auVar181,auVar125);
            auVar181 = vsubps_avx(auVar217,auVar181);
            auVar346._8_4_ = 0x3f318000;
            auVar346._0_8_ = 0x3f3180003f318000;
            auVar346._12_4_ = 0x3f318000;
            auVar217 = vfmsub231ps_fma(auVar93,auVar181,auVar346);
            auVar262._8_4_ = 0xb95e8083;
            auVar262._0_8_ = 0xb95e8083b95e8083;
            auVar262._12_4_ = 0xb95e8083;
            auVar93 = vfnmsub231ps_fma(auVar217,auVar181,auVar262);
            auVar215._0_4_ = auVar93._0_4_ * auVar93._0_4_;
            auVar215._4_4_ = auVar93._4_4_ * auVar93._4_4_;
            auVar215._8_4_ = auVar93._8_4_ * auVar93._8_4_;
            auVar215._12_4_ = auVar93._12_4_ * auVar93._12_4_;
            auVar372._8_4_ = 0x39506967;
            auVar372._0_8_ = 0x3950696739506967;
            auVar372._12_4_ = 0x39506967;
            auVar364._8_4_ = 0x3ab743ce;
            auVar364._0_8_ = 0x3ab743ce3ab743ce;
            auVar364._12_4_ = 0x3ab743ce;
            auVar217 = vfmadd213ps_fma(auVar372,auVar93,auVar364);
            auVar282._8_4_ = 0x3c088908;
            auVar282._0_8_ = 0x3c0889083c088908;
            auVar282._12_4_ = 0x3c088908;
            auVar217 = vfmadd213ps_fma(auVar217,auVar93,auVar282);
            auVar303._8_4_ = 0x3d2aa9c1;
            auVar303._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar303._12_4_ = 0x3d2aa9c1;
            auVar217 = vfmadd213ps_fma(auVar217,auVar93,auVar303);
            auVar304._8_4_ = 0x3e2aaaaa;
            auVar304._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar304._12_4_ = 0x3e2aaaaa;
            auVar217 = vfmadd213ps_fma(auVar217,auVar93,auVar304);
            auVar217 = vfmadd213ps_fma(auVar217,auVar93,auVar243);
            auVar217 = vfmadd213ps_fma(auVar217,auVar215,auVar93);
            auVar216._0_4_ = auVar217._0_4_ + fVar87;
            auVar216._4_4_ = auVar217._4_4_ + fVar123;
            auVar216._8_4_ = auVar217._8_4_ + fVar3;
            auVar216._12_4_ = auVar217._12_4_ + fVar4;
            auVar127._0_4_ = (int)auVar181._0_4_;
            auVar127._4_4_ = (int)auVar181._4_4_;
            auVar127._8_4_ = (int)auVar181._8_4_;
            auVar127._12_4_ = (int)auVar181._12_4_;
            auVar181 = vpslld_avx(auVar127,0x17);
            auVar181 = vpaddd_avx(auVar181,auVar125);
            auVar284 = vfmadd213ps_fma(auVar181,auVar216,auVar125);
            auVar182._8_4_ = 0x800000;
            auVar182._0_8_ = 0x80000000800000;
            auVar182._12_4_ = 0x800000;
            auVar181 = vmaxps_avx(auVar284,auVar182);
            auVar217 = vpsrld_avx(auVar181,0x17);
            auVar293._8_4_ = 0xffffff82;
            auVar293._0_8_ = 0xffffff82ffffff82;
            auVar293._12_4_ = 0xffffff82;
            auVar217 = vpaddd_avx(auVar293,auVar217);
            auVar294._8_4_ = 0x807fffff;
            auVar294._0_8_ = 0x807fffff807fffff;
            auVar294._12_4_ = 0x807fffff;
            auVar181 = vandps_avx(auVar294,auVar181);
            auVar263 = vorps_avx(auVar181,auVar243);
            auVar93 = vcvtdq2ps_avx(auVar217);
            auVar295._8_4_ = 0x3f3504f3;
            auVar295._0_8_ = 0x3f3504f33f3504f3;
            auVar295._12_4_ = 0x3f3504f3;
            auVar217 = vcmpps_avx(auVar263,auVar295,1);
            auVar181 = vandps_avx(auVar217,auVar263);
            auVar183._0_4_ = auVar181._0_4_ + auVar263._0_4_ + -1.0;
            auVar183._4_4_ = auVar181._4_4_ + auVar263._4_4_ + -1.0;
            auVar183._8_4_ = auVar181._8_4_ + auVar263._8_4_ + -1.0;
            auVar183._12_4_ = auVar181._12_4_ + auVar263._12_4_ + -1.0;
            auVar181 = vandps_avx(auVar217,auVar125);
            auVar217 = vsubps_avx(auVar93,auVar181);
            auVar296._0_4_ = auVar183._0_4_ * auVar183._0_4_;
            auVar296._4_4_ = auVar183._4_4_ * auVar183._4_4_;
            auVar296._8_4_ = auVar183._8_4_ * auVar183._8_4_;
            auVar296._12_4_ = auVar183._12_4_ * auVar183._12_4_;
            auVar305._8_4_ = 0x3d9021bb;
            auVar305._0_8_ = 0x3d9021bb3d9021bb;
            auVar305._12_4_ = 0x3d9021bb;
            auVar317._8_4_ = 0xbdebd1b8;
            auVar317._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar317._12_4_ = 0xbdebd1b8;
            auVar181 = vfmadd213ps_fma(auVar305,auVar183,auVar317);
            auVar318._8_4_ = 0x3def251a;
            auVar318._0_8_ = 0x3def251a3def251a;
            auVar318._12_4_ = 0x3def251a;
            auVar181 = vfmadd213ps_fma(auVar181,auVar183,auVar318);
            auVar319._8_4_ = 0xbdfe5d4f;
            auVar319._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar319._12_4_ = 0xbdfe5d4f;
            auVar181 = vfmadd213ps_fma(auVar181,auVar183,auVar319);
            auVar320._8_4_ = 0x3e11e9bf;
            auVar320._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar320._12_4_ = 0x3e11e9bf;
            auVar181 = vfmadd213ps_fma(auVar181,auVar183,auVar320);
            auVar321._8_4_ = 0xbe2aae50;
            auVar321._0_8_ = 0xbe2aae50be2aae50;
            auVar321._12_4_ = 0xbe2aae50;
            auVar181 = vfmadd213ps_fma(auVar181,auVar183,auVar321);
            auVar322._8_4_ = 0x3e4cceac;
            auVar322._0_8_ = 0x3e4cceac3e4cceac;
            auVar322._12_4_ = 0x3e4cceac;
            auVar181 = vfmadd213ps_fma(auVar181,auVar183,auVar322);
            auVar323._8_4_ = 0xbe7ffffc;
            auVar323._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar323._12_4_ = 0xbe7ffffc;
            auVar181 = vfmadd213ps_fma(auVar181,auVar183,auVar323);
            auVar324._8_4_ = 0x3eaaaaaa;
            auVar324._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar324._12_4_ = 0x3eaaaaaa;
            auVar181 = vfmadd213ps_fma(auVar181,auVar183,auVar324);
            auVar306._0_4_ = auVar296._0_4_ * auVar183._0_4_ * auVar181._0_4_;
            auVar306._4_4_ = auVar296._4_4_ * auVar183._4_4_ * auVar181._4_4_;
            auVar306._8_4_ = auVar296._8_4_ * auVar183._8_4_ * auVar181._8_4_;
            auVar306._12_4_ = auVar296._12_4_ * auVar183._12_4_ * auVar181._12_4_;
            auVar181 = vfmadd231ps_fma(auVar306,auVar217,auVar262);
            auVar93 = vfmsub231ps_fma(auVar181,auVar243,auVar296);
            auVar181 = vcmpps_avx(auVar284,_DAT_0054c060,2);
            auVar93 = vsubps_avx(auVar93,auVar183);
            auVar217 = vfnmadd231ps_fma(auVar93,auVar346,auVar217);
            auVar184._0_4_ = auVar217._0_4_ + auVar217._0_4_;
            auVar184._4_4_ = auVar217._4_4_ + auVar217._4_4_;
            auVar184._8_4_ = auVar217._8_4_ + auVar217._8_4_;
            auVar184._12_4_ = auVar217._12_4_ + auVar217._12_4_;
            auVar218._8_4_ = 0x7fffffff;
            auVar218._0_8_ = 0x7fffffff7fffffff;
            auVar218._12_4_ = 0x7fffffff;
            auVar181 = vblendvps_avx(auVar184,auVar218,auVar181);
            auVar185._8_4_ = 0x42b0c0a5;
            auVar185._0_8_ = 0x42b0c0a542b0c0a5;
            auVar185._12_4_ = 0x42b0c0a5;
            auVar181 = vminps_avx(auVar181,auVar185);
            auVar93 = vmaxps_avx(auVar353,auVar181);
            auVar181 = vfmadd213ps_fma(auVar360,auVar93,auVar243);
            auVar219._0_4_ = (int)auVar181._0_4_;
            auVar219._4_4_ = (int)auVar181._4_4_;
            auVar219._8_4_ = (int)auVar181._8_4_;
            auVar219._12_4_ = (int)auVar181._12_4_;
            auVar217 = vcvtdq2ps_avx(auVar219);
            auVar181 = vcmpps_avx(auVar181,auVar217,1);
            auVar181 = vandps_avx(auVar181,auVar125);
            auVar181 = vsubps_avx(auVar217,auVar181);
            auVar217 = vfmsub231ps_fma(auVar93,auVar181,auVar346);
            auVar93 = vfnmsub231ps_fma(auVar217,auVar181,auVar262);
            auVar122 = ZEXT1664(auVar125);
            auVar220._0_4_ = auVar93._0_4_ * auVar93._0_4_;
            auVar220._4_4_ = auVar93._4_4_ * auVar93._4_4_;
            auVar220._8_4_ = auVar93._8_4_ * auVar93._8_4_;
            auVar220._12_4_ = auVar93._12_4_ * auVar93._12_4_;
            auVar217 = vfmadd213ps_fma(auVar372,auVar93,auVar364);
            auVar217 = vfmadd213ps_fma(auVar217,auVar93,auVar282);
            auVar66._8_4_ = 0x3d2aa9c1;
            auVar66._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar66._12_4_ = 0x3d2aa9c1;
            auVar217 = vfmadd213ps_fma(auVar217,auVar93,auVar66);
            auVar67._8_4_ = 0x3e2aaaaa;
            auVar67._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar67._12_4_ = 0x3e2aaaaa;
            auVar217 = vfmadd213ps_fma(auVar217,auVar93,auVar67);
            auVar217 = vfmadd213ps_fma(auVar217,auVar93,auVar243);
            auVar217 = vfmadd213ps_fma(auVar217,auVar220,auVar93);
            auVar128._0_4_ = auVar217._0_4_ + fVar87;
            auVar128._4_4_ = auVar217._4_4_ + fVar123;
            auVar128._8_4_ = auVar217._8_4_ + fVar3;
            auVar128._12_4_ = auVar217._12_4_ + fVar4;
            auVar186._0_4_ = (int)auVar181._0_4_;
            auVar186._4_4_ = (int)auVar181._4_4_;
            auVar186._8_4_ = (int)auVar181._8_4_;
            auVar186._12_4_ = (int)auVar181._12_4_;
            auVar181 = vpslld_avx(auVar186,0x17);
            auVar181 = vpaddd_avx(auVar181,auVar125);
            auVar181 = vfmadd213ps_fma(auVar181,auVar128,auVar125);
            auVar125 = vrcpps_avx(auVar181);
            auVar221._0_4_ = auVar125._0_4_ + auVar125._0_4_;
            auVar221._4_4_ = auVar125._4_4_ + auVar125._4_4_;
            auVar221._8_4_ = auVar125._8_4_ + auVar125._8_4_;
            auVar221._12_4_ = auVar125._12_4_ + auVar125._12_4_;
            auVar68._8_4_ = 0x40000000;
            auVar68._0_8_ = 0x4000000040000000;
            auVar68._12_4_ = 0x40000000;
            auVar181 = vfmsub213ps_fma(auVar181,auVar221,auVar68);
            auVar125 = vfnmadd213ps_fma(auVar181,auVar125,auVar221);
            auVar89 = vfmsub231ps_fma(auVar89,auVar89,auVar125);
            break;
          case 6:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var22);
            auVar133._4_4_ = uVar1;
            auVar133._0_4_ = uVar1;
            auVar133._8_4_ = uVar1;
            auVar133._12_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var22))[1];
            auVar192._4_4_ = uVar1;
            auVar192._0_4_ = uVar1;
            auVar192._8_4_ = uVar1;
            auVar192._12_4_ = uVar1;
            auVar181 = vfmadd231ps_fma(auVar192,auVar89,auVar133);
            auVar181 = vmaxps_avx(auVar181,_DAT_0054c060);
            auVar125 = vminps_avx(auVar181,auVar125);
            auVar89._0_4_ = auVar125._0_4_ * auVar89._0_4_;
            auVar89._4_4_ = auVar125._4_4_ * auVar89._4_4_;
            auVar89._8_4_ = auVar125._8_4_ * auVar89._8_4_;
            auVar89._12_4_ = auVar125._12_4_ * auVar89._12_4_;
          }
          *(undefined1 (*) [16])((long)top_blob->data + lVar46 * 0x10) = auVar89;
          lVar46 = lVar46 + 1;
        } while (lVar46 != iVar36);
      }
      iVar36 = 0;
    }
    else if (iVar42 == 8) {
      iVar36 = top_blob->w;
      if (0 < (long)iVar36) {
        p_Var22 = this->_vptr_InnerProduct_x86_fma[-3];
        uVar39 = local_380 * iStack_36c;
        uVar20 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var22);
        lVar61 = *(long *)(&this->field_0x178 + (long)p_Var22);
        lVar46 = 0;
        auVar299._8_4_ = 0x3f000000;
        auVar299._0_8_ = 0x3f0000003f000000;
        auVar299._12_4_ = 0x3f000000;
        auVar299._16_4_ = 0x3f000000;
        auVar299._20_4_ = 0x3f000000;
        auVar299._24_4_ = 0x3f000000;
        auVar299._28_4_ = 0x3f000000;
        auVar267._8_4_ = 0x3f800000;
        auVar267._0_8_ = 0x3f8000003f800000;
        auVar267._12_4_ = 0x3f800000;
        auVar267._16_4_ = 0x3f800000;
        auVar267._20_4_ = 0x3f800000;
        auVar267._24_4_ = 0x3f800000;
        auVar267._28_4_ = 0x3f800000;
        do {
          auVar122 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar61 != 0) {
            auVar122 = ZEXT3264(*(undefined1 (*) [32])(lVar61 + lVar46 * 0x20));
          }
          pauVar50 = (undefined1 (*) [32])
                     ((this->weight_data_tm).w * lVar46 * (this->weight_data_tm).elemsize +
                     (long)(this->weight_data_tm).data);
          pauVar38 = local_398;
          if ((int)uVar39 < 8) {
            auVar155 = SUB6432(ZEXT864(0),0);
            auVar81 = SUB6432(ZEXT864(0),0);
            auVar83 = SUB6432(ZEXT864(0),0);
            auVar111 = SUB6432(ZEXT864(0),0);
            auVar213 = ZEXT864(0);
            auVar315 = ZEXT864(0);
            auVar379 = ZEXT864(0);
            uVar32 = 0;
          }
          else {
            auVar379 = ZEXT864(0);
            iVar42 = 7;
            auVar315 = ZEXT864(0);
            auVar213 = ZEXT864(0);
            auVar352 = ZEXT864(0);
            auVar261 = ZEXT864(0);
            auVar359 = ZEXT864(0);
            auVar179 = ZEXT864(0);
            do {
              auVar155 = vlddqu_avx(*pauVar50);
              uVar1 = *(undefined4 *)*pauVar38;
              auVar368._4_4_ = uVar1;
              auVar368._0_4_ = uVar1;
              auVar368._8_4_ = uVar1;
              auVar368._12_4_ = uVar1;
              auVar368._16_4_ = uVar1;
              auVar368._20_4_ = uVar1;
              auVar368._24_4_ = uVar1;
              auVar368._28_4_ = uVar1;
              auVar83 = vcvtph2ps_f16c(auVar155._0_16_);
              auVar125 = vfmadd231ps_fma(auVar122._0_32_,auVar368,auVar83);
              auVar122 = ZEXT1664(auVar125);
              uVar1 = *(undefined4 *)(*pauVar38 + 4);
              auVar326._4_4_ = uVar1;
              auVar326._0_4_ = uVar1;
              auVar326._8_4_ = uVar1;
              auVar326._12_4_ = uVar1;
              auVar326._16_4_ = uVar1;
              auVar326._20_4_ = uVar1;
              auVar326._24_4_ = uVar1;
              auVar326._28_4_ = uVar1;
              auVar83 = vcvtph2ps_f16c(auVar155._16_16_);
              auVar155 = vlddqu_avx(pauVar50[1]);
              uVar1 = *(undefined4 *)(*pauVar38 + 8);
              auVar286._4_4_ = uVar1;
              auVar286._0_4_ = uVar1;
              auVar286._8_4_ = uVar1;
              auVar286._12_4_ = uVar1;
              auVar286._16_4_ = uVar1;
              auVar286._20_4_ = uVar1;
              auVar286._24_4_ = uVar1;
              auVar286._28_4_ = uVar1;
              auVar125 = vfmadd231ps_fma(auVar379._0_32_,auVar326,auVar83);
              auVar379 = ZEXT1664(auVar125);
              auVar83 = vcvtph2ps_f16c(auVar155._0_16_);
              uVar1 = *(undefined4 *)(*pauVar38 + 0xc);
              auVar361._4_4_ = uVar1;
              auVar361._0_4_ = uVar1;
              auVar361._8_4_ = uVar1;
              auVar361._12_4_ = uVar1;
              auVar361._16_4_ = uVar1;
              auVar361._20_4_ = uVar1;
              auVar361._24_4_ = uVar1;
              auVar361._28_4_ = uVar1;
              auVar125 = vfmadd231ps_fma(auVar315._0_32_,auVar286,auVar83);
              auVar315 = ZEXT1664(auVar125);
              auVar155 = vcvtph2ps_f16c(auVar155._16_16_);
              auVar125 = vfmadd231ps_fma(auVar213._0_32_,auVar361,auVar155);
              auVar213 = ZEXT1664(auVar125);
              auVar155 = vlddqu_avx(pauVar50[2]);
              uVar1 = *(undefined4 *)(*pauVar38 + 0x10);
              auVar327._4_4_ = uVar1;
              auVar327._0_4_ = uVar1;
              auVar327._8_4_ = uVar1;
              auVar327._12_4_ = uVar1;
              auVar327._16_4_ = uVar1;
              auVar327._20_4_ = uVar1;
              auVar327._24_4_ = uVar1;
              auVar327._28_4_ = uVar1;
              auVar83 = vcvtph2ps_f16c(auVar155._0_16_);
              auVar125 = vfmadd231ps_fma(auVar352._0_32_,auVar327,auVar83);
              auVar352 = ZEXT1664(auVar125);
              auVar111 = ZEXT1632(auVar125);
              uVar1 = *(undefined4 *)(*pauVar38 + 0x14);
              auVar328._4_4_ = uVar1;
              auVar328._0_4_ = uVar1;
              auVar328._8_4_ = uVar1;
              auVar328._12_4_ = uVar1;
              auVar328._16_4_ = uVar1;
              auVar328._20_4_ = uVar1;
              auVar328._24_4_ = uVar1;
              auVar328._28_4_ = uVar1;
              auVar83 = vcvtph2ps_f16c(auVar155._16_16_);
              auVar155 = vlddqu_avx(pauVar50[3]);
              uVar1 = *(undefined4 *)(*pauVar38 + 0x18);
              auVar369._4_4_ = uVar1;
              auVar369._0_4_ = uVar1;
              auVar369._8_4_ = uVar1;
              auVar369._12_4_ = uVar1;
              auVar369._16_4_ = uVar1;
              auVar369._20_4_ = uVar1;
              auVar369._24_4_ = uVar1;
              auVar369._28_4_ = uVar1;
              auVar125 = vfmadd231ps_fma(auVar261._0_32_,auVar328,auVar83);
              auVar261 = ZEXT1664(auVar125);
              auVar83 = ZEXT1632(auVar125);
              auVar81 = vcvtph2ps_f16c(auVar155._0_16_);
              uVar1 = *(undefined4 *)(*pauVar38 + 0x1c);
              auVar329._4_4_ = uVar1;
              auVar329._0_4_ = uVar1;
              auVar329._8_4_ = uVar1;
              auVar329._12_4_ = uVar1;
              auVar329._16_4_ = uVar1;
              auVar329._20_4_ = uVar1;
              auVar329._24_4_ = uVar1;
              auVar329._28_4_ = uVar1;
              auVar125 = vfmadd231ps_fma(auVar359._0_32_,auVar369,auVar81);
              auVar359 = ZEXT1664(auVar125);
              auVar81 = ZEXT1632(auVar125);
              auVar155 = vcvtph2ps_f16c(auVar155._16_16_);
              auVar125 = vfmadd231ps_fma(auVar179._0_32_,auVar329,auVar155);
              auVar179 = ZEXT1664(auVar125);
              auVar155 = ZEXT1632(auVar125);
              pauVar38 = pauVar38 + 1;
              pauVar50 = pauVar50 + 4;
              iVar42 = iVar42 + 8;
              uVar32 = uVar39 & 0xfffffff8;
            } while (iVar42 < (int)uVar39);
          }
          auVar178 = auVar379._0_32_;
          auVar177 = auVar315._0_32_;
          auVar121 = auVar213._0_32_;
          uVar57 = uVar32 | 3;
          while (auVar105 = auVar122._0_32_, (int)uVar57 < (int)uVar39) {
            auVar121 = vlddqu_avx(*pauVar50);
            uVar1 = *(undefined4 *)*pauVar38;
            auVar330._4_4_ = uVar1;
            auVar330._0_4_ = uVar1;
            auVar330._8_4_ = uVar1;
            auVar330._12_4_ = uVar1;
            auVar330._16_4_ = uVar1;
            auVar330._20_4_ = uVar1;
            auVar330._24_4_ = uVar1;
            auVar330._28_4_ = uVar1;
            auVar177 = vcvtph2ps_f16c(auVar121._0_16_);
            auVar125 = vfmadd231ps_fma(auVar105,auVar330,auVar177);
            auVar122 = ZEXT1664(auVar125);
            uVar1 = *(undefined4 *)(*pauVar38 + 4);
            auVar331._4_4_ = uVar1;
            auVar331._0_4_ = uVar1;
            auVar331._8_4_ = uVar1;
            auVar331._12_4_ = uVar1;
            auVar331._16_4_ = uVar1;
            auVar331._20_4_ = uVar1;
            auVar331._24_4_ = uVar1;
            auVar331._28_4_ = uVar1;
            auVar121 = vcvtph2ps_f16c(auVar121._16_16_);
            auVar125 = vfmadd231ps_fma(auVar379._0_32_,auVar331,auVar121);
            auVar379 = ZEXT1664(auVar125);
            auVar178 = ZEXT1632(auVar125);
            auVar121 = vlddqu_avx(pauVar50[1]);
            uVar1 = *(undefined4 *)(*pauVar38 + 8);
            auVar332._4_4_ = uVar1;
            auVar332._0_4_ = uVar1;
            auVar332._8_4_ = uVar1;
            auVar332._12_4_ = uVar1;
            auVar332._16_4_ = uVar1;
            auVar332._20_4_ = uVar1;
            auVar332._24_4_ = uVar1;
            auVar332._28_4_ = uVar1;
            auVar177 = vcvtph2ps_f16c(auVar121._0_16_);
            auVar125 = vfmadd231ps_fma(auVar315._0_32_,auVar332,auVar177);
            auVar315 = ZEXT1664(auVar125);
            auVar177 = ZEXT1632(auVar125);
            uVar1 = *(undefined4 *)(*pauVar38 + 0xc);
            auVar333._4_4_ = uVar1;
            auVar333._0_4_ = uVar1;
            auVar333._8_4_ = uVar1;
            auVar333._12_4_ = uVar1;
            auVar333._16_4_ = uVar1;
            auVar333._20_4_ = uVar1;
            auVar333._24_4_ = uVar1;
            auVar333._28_4_ = uVar1;
            auVar121 = vcvtph2ps_f16c(auVar121._16_16_);
            auVar125 = vfmadd231ps_fma(auVar213._0_32_,auVar333,auVar121);
            auVar213 = ZEXT1664(auVar125);
            auVar121 = ZEXT1632(auVar125);
            pauVar38 = (undefined1 (*) [32])(*pauVar38 + 0x10);
            pauVar50 = pauVar50 + 2;
            uVar57 = uVar32 + 7;
            uVar32 = uVar32 + 4;
          }
          if (uVar39 - uVar32 != 0 && (int)uVar32 <= (int)uVar39) {
            lVar52 = 0;
            do {
              uVar1 = *(undefined4 *)(*pauVar38 + lVar52 * 4);
              auVar287._4_4_ = uVar1;
              auVar287._0_4_ = uVar1;
              auVar287._8_4_ = uVar1;
              auVar287._12_4_ = uVar1;
              auVar287._16_4_ = uVar1;
              auVar287._20_4_ = uVar1;
              auVar287._24_4_ = uVar1;
              auVar287._28_4_ = uVar1;
              auVar125 = vlddqu_avx(*(undefined1 (*) [16])*pauVar50);
              auVar105 = vcvtph2ps_f16c(auVar125);
              auVar125 = vfmadd231ps_fma(auVar122._0_32_,auVar287,auVar105);
              auVar122 = ZEXT1664(auVar125);
              auVar105 = ZEXT1632(auVar125);
              pauVar50 = (undefined1 (*) [32])(*pauVar50 + 0x10);
              lVar52 = lVar52 + 1;
            } while (uVar39 - uVar32 != (int)lVar52);
          }
          fVar87 = auVar81._0_4_ + auVar155._0_4_ + auVar111._0_4_ + auVar83._0_4_ +
                   auVar178._0_4_ + auVar177._0_4_ + auVar121._0_4_ + auVar105._0_4_;
          fVar123 = auVar81._4_4_ + auVar155._4_4_ + auVar111._4_4_ + auVar83._4_4_ +
                    auVar178._4_4_ + auVar177._4_4_ + auVar121._4_4_ + auVar105._4_4_;
          auVar106._0_8_ = CONCAT44(fVar123,fVar87);
          auVar106._8_4_ =
               auVar81._8_4_ + auVar155._8_4_ + auVar111._8_4_ + auVar83._8_4_ +
               auVar178._8_4_ + auVar177._8_4_ + auVar121._8_4_ + auVar105._8_4_;
          auVar106._12_4_ =
               auVar81._12_4_ + auVar155._12_4_ + auVar111._12_4_ + auVar83._12_4_ +
               auVar178._12_4_ + auVar177._12_4_ + auVar121._12_4_ + auVar105._12_4_;
          auVar106._16_4_ =
               auVar81._16_4_ + auVar155._16_4_ + auVar111._16_4_ + auVar83._16_4_ +
               auVar178._16_4_ + auVar177._16_4_ + auVar121._16_4_ + auVar105._16_4_;
          auVar106._20_4_ =
               auVar81._20_4_ + auVar155._20_4_ + auVar111._20_4_ + auVar83._20_4_ +
               auVar178._20_4_ + auVar177._20_4_ + auVar121._20_4_ + auVar105._20_4_;
          auVar106._24_4_ =
               auVar81._24_4_ + auVar155._24_4_ + auVar111._24_4_ + auVar83._24_4_ +
               auVar178._24_4_ + auVar177._24_4_ + auVar121._24_4_ + auVar105._24_4_;
          auVar106._28_4_ =
               auVar81._28_4_ + auVar155._28_4_ + auVar111._28_4_ + auVar83._28_4_ +
               auVar178._28_4_ + auVar177._28_4_ + auVar121._28_4_ + auVar105._28_4_;
          switch(uVar20) {
          case 1:
            auVar106 = vmaxps_avx(auVar106,_DAT_005513a0);
            break;
          case 2:
            auVar155 = vmaxps_avx(auVar106,ZEXT1632(ZEXT816(0) << 0x40));
            auVar83 = vminps_avx(auVar106,ZEXT1632(ZEXT816(0) << 0x40));
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var22);
            auVar110._4_4_ = uVar1;
            auVar110._0_4_ = uVar1;
            auVar110._8_4_ = uVar1;
            auVar110._12_4_ = uVar1;
            auVar110._16_4_ = uVar1;
            auVar110._20_4_ = uVar1;
            auVar110._24_4_ = uVar1;
            auVar110._28_4_ = uVar1;
            auVar125 = vfmadd213ps_fma(auVar110,auVar83,auVar155);
            auVar106 = ZEXT1632(auVar125);
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var22);
            auVar160._4_4_ = uVar1;
            auVar160._0_4_ = uVar1;
            auVar160._8_4_ = uVar1;
            auVar160._12_4_ = uVar1;
            auVar160._16_4_ = uVar1;
            auVar160._20_4_ = uVar1;
            auVar160._24_4_ = uVar1;
            auVar160._28_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var22))[1];
            auVar205._4_4_ = uVar1;
            auVar205._0_4_ = uVar1;
            auVar205._8_4_ = uVar1;
            auVar205._12_4_ = uVar1;
            auVar205._16_4_ = uVar1;
            auVar205._20_4_ = uVar1;
            auVar205._24_4_ = uVar1;
            auVar205._28_4_ = uVar1;
            auVar155 = vmaxps_avx(auVar106,auVar160);
            auVar106 = vminps_avx(auVar155,auVar205);
            break;
          case 4:
            auVar107._0_8_ = auVar106._0_8_ ^ 0x8000000080000000;
            auVar107._8_4_ = -auVar106._8_4_;
            auVar107._12_4_ = -auVar106._12_4_;
            auVar107._16_4_ = -auVar106._16_4_;
            auVar107._20_4_ = -auVar106._20_4_;
            auVar107._24_4_ = -auVar106._24_4_;
            auVar107._28_4_ = -auVar106._28_4_;
            auVar161._8_4_ = 0x42b0c0a5;
            auVar161._0_8_ = 0x42b0c0a542b0c0a5;
            auVar161._12_4_ = 0x42b0c0a5;
            auVar161._16_4_ = 0x42b0c0a5;
            auVar161._20_4_ = 0x42b0c0a5;
            auVar161._24_4_ = 0x42b0c0a5;
            auVar161._28_4_ = 0x42b0c0a5;
            auVar155 = vminps_avx(auVar107,auVar161);
            auVar162._8_4_ = 0xc2b0c0a5;
            auVar162._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar162._12_4_ = 0xc2b0c0a5;
            auVar162._16_4_ = 0xc2b0c0a5;
            auVar162._20_4_ = 0xc2b0c0a5;
            auVar162._24_4_ = 0xc2b0c0a5;
            auVar162._28_4_ = 0xc2b0c0a5;
            auVar83 = vmaxps_avx(auVar155,auVar162);
            auVar163._8_4_ = 0x3fb8aa3b;
            auVar163._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar163._12_4_ = 0x3fb8aa3b;
            auVar163._16_4_ = 0x3fb8aa3b;
            auVar163._20_4_ = 0x3fb8aa3b;
            auVar163._24_4_ = 0x3fb8aa3b;
            auVar163._28_4_ = 0x3fb8aa3b;
            auVar125 = vfmadd213ps_fma(auVar163,auVar83,auVar299);
            auVar111 = vroundps_avx(ZEXT1632(auVar125),1);
            auVar155 = vcmpps_avx(ZEXT1632(auVar125),auVar111,1);
            auVar155 = vandps_avx(auVar155,auVar267);
            auVar155 = vsubps_avx(auVar111,auVar155);
            auVar206._8_4_ = 0x3f318000;
            auVar206._0_8_ = 0x3f3180003f318000;
            auVar206._12_4_ = 0x3f318000;
            auVar206._16_4_ = 0x3f318000;
            auVar206._20_4_ = 0x3f318000;
            auVar206._24_4_ = 0x3f318000;
            auVar206._28_4_ = 0x3f318000;
            auVar125 = vfmsub231ps_fma(auVar83,auVar155,auVar206);
            auVar207._8_4_ = 0x395e8083;
            auVar207._0_8_ = 0x395e8083395e8083;
            auVar207._12_4_ = 0x395e8083;
            auVar207._16_4_ = 0x395e8083;
            auVar207._20_4_ = 0x395e8083;
            auVar207._24_4_ = 0x395e8083;
            auVar207._28_4_ = 0x395e8083;
            auVar181 = vfmsub231ps_fma(ZEXT1632(auVar125),auVar155,auVar207);
            auVar83 = ZEXT1632(auVar181);
            auVar28._28_4_ = 0x395e8083;
            auVar28._0_28_ =
                 ZEXT1628(CONCAT412(auVar181._12_4_ * auVar181._12_4_,
                                    CONCAT48(auVar181._8_4_ * auVar181._8_4_,
                                             CONCAT44(auVar181._4_4_ * auVar181._4_4_,
                                                      auVar181._0_4_ * auVar181._0_4_))));
            auVar252._8_4_ = 0x39506967;
            auVar252._0_8_ = 0x3950696739506967;
            auVar252._12_4_ = 0x39506967;
            auVar252._16_4_ = 0x39506967;
            auVar252._20_4_ = 0x39506967;
            auVar252._24_4_ = 0x39506967;
            auVar252._28_4_ = 0x39506967;
            auVar291._8_4_ = 0x3ab743ce;
            auVar291._0_8_ = 0x3ab743ce3ab743ce;
            auVar291._12_4_ = 0x3ab743ce;
            auVar291._16_4_ = 0x3ab743ce;
            auVar291._20_4_ = 0x3ab743ce;
            auVar291._24_4_ = 0x3ab743ce;
            auVar291._28_4_ = 0x3ab743ce;
            auVar125 = vfmadd213ps_fma(auVar252,auVar83,auVar291);
            auVar238._8_4_ = 0x3c088908;
            auVar238._0_8_ = 0x3c0889083c088908;
            auVar238._12_4_ = 0x3c088908;
            auVar238._16_4_ = 0x3c088908;
            auVar238._20_4_ = 0x3c088908;
            auVar238._24_4_ = 0x3c088908;
            auVar238._28_4_ = 0x3c088908;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar238);
            auVar79._8_4_ = 0x3d2aa9c1;
            auVar79._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar79._12_4_ = 0x3d2aa9c1;
            auVar79._16_4_ = 0x3d2aa9c1;
            auVar79._20_4_ = 0x3d2aa9c1;
            auVar79._24_4_ = 0x3d2aa9c1;
            auVar79._28_4_ = 0x3d2aa9c1;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar79);
            auVar80._8_4_ = 0x3e2aaaaa;
            auVar80._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar80._12_4_ = 0x3e2aaaaa;
            auVar80._16_4_ = 0x3e2aaaaa;
            auVar80._20_4_ = 0x3e2aaaaa;
            auVar80._24_4_ = 0x3e2aaaaa;
            auVar80._28_4_ = 0x3e2aaaaa;
            auVar83 = ZEXT1632(auVar181);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar80);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar299);
            auVar217 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar28,auVar83);
            auVar88._0_4_ = (int)auVar155._0_4_;
            auVar88._4_4_ = (int)auVar155._4_4_;
            auVar88._8_4_ = (int)auVar155._8_4_;
            auVar88._12_4_ = (int)auVar155._12_4_;
            auVar108._16_4_ = (int)auVar155._16_4_;
            auVar108._0_16_ = auVar88;
            auVar108._20_4_ = (int)auVar155._20_4_;
            auVar108._24_4_ = (int)auVar155._24_4_;
            auVar108._28_4_ = (int)auVar155._28_4_;
            auVar181 = vpslld_avx(auVar88,0x17);
            auVar125 = vpslld_avx(auVar108._16_16_,0x17);
            auVar65._8_4_ = 0x3f800000;
            auVar65._0_8_ = 0x3f8000003f800000;
            auVar65._12_4_ = 0x3f800000;
            auVar125 = vpaddd_avx(auVar125,auVar65);
            auVar181 = vpaddd_avx(auVar181,auVar65);
            auVar109._16_16_ = auVar125;
            auVar109._0_16_ = auVar181;
            auVar164._0_4_ = auVar217._0_4_ + 1.0;
            auVar164._4_4_ = auVar217._4_4_ + 1.0;
            auVar164._8_4_ = auVar217._8_4_ + 1.0;
            auVar164._12_4_ = auVar217._12_4_ + 1.0;
            auVar164._16_4_ = 0x3f800000;
            auVar164._20_4_ = 0x3f800000;
            auVar164._24_4_ = 0x3f800000;
            auVar164._28_4_ = 0x3f800000;
            auVar125 = vfmadd213ps_fma(auVar109,auVar164,auVar267);
            auVar155 = vrcpps_avx(ZEXT1632(auVar125));
            auVar125 = vfmsub213ps_fma(ZEXT1632(auVar125),auVar155,auVar267);
            auVar125 = vfnmadd132ps_fma(ZEXT1632(auVar125),auVar155,auVar155);
            auVar106 = ZEXT1632(auVar125);
            break;
          case 5:
            auVar348._8_4_ = 0x42b0c0a5;
            auVar348._0_8_ = 0x42b0c0a542b0c0a5;
            auVar348._12_4_ = 0x42b0c0a5;
            auVar348._16_4_ = 0x42b0c0a5;
            auVar348._20_4_ = 0x42b0c0a5;
            auVar348._24_4_ = 0x42b0c0a5;
            auVar348._28_4_ = 0x42b0c0a5;
            auVar155 = vminps_avx(auVar348,auVar106);
            auVar355._8_4_ = 0xc2b0c0a5;
            auVar355._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar355._12_4_ = 0xc2b0c0a5;
            auVar355._16_4_ = 0xc2b0c0a5;
            auVar355._20_4_ = 0xc2b0c0a5;
            auVar355._24_4_ = 0xc2b0c0a5;
            auVar355._28_4_ = 0xc2b0c0a5;
            auVar83 = vmaxps_avx(auVar355,auVar155);
            auVar197._8_4_ = 0x3fb8aa3b;
            auVar197._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar197._12_4_ = 0x3fb8aa3b;
            auVar197._16_4_ = 0x3fb8aa3b;
            auVar197._20_4_ = 0x3fb8aa3b;
            auVar197._24_4_ = 0x3fb8aa3b;
            auVar197._28_4_ = 0x3fb8aa3b;
            auVar125 = vfmadd213ps_fma(auVar197,auVar83,auVar299);
            auVar111 = vroundps_avx(ZEXT1632(auVar125),1);
            auVar155 = vcmpps_avx(ZEXT1632(auVar125),auVar111,1);
            auVar155 = vandps_avx(auVar155,auVar267);
            auVar155 = vsubps_avx(auVar111,auVar155);
            auVar370._8_4_ = 0x3f318000;
            auVar370._0_8_ = 0x3f3180003f318000;
            auVar370._12_4_ = 0x3f318000;
            auVar370._16_4_ = 0x3f318000;
            auVar370._20_4_ = 0x3f318000;
            auVar370._24_4_ = 0x3f318000;
            auVar370._28_4_ = 0x3f318000;
            auVar125 = vfmsub231ps_fma(auVar83,auVar155,auVar370);
            auVar356._8_4_ = 0xb95e8083;
            auVar356._0_8_ = 0xb95e8083b95e8083;
            auVar356._12_4_ = 0xb95e8083;
            auVar356._16_4_ = 0xb95e8083;
            auVar356._20_4_ = 0xb95e8083;
            auVar356._24_4_ = 0xb95e8083;
            auVar356._28_4_ = 0xb95e8083;
            auVar181 = vfnmsub231ps_fma(ZEXT1632(auVar125),auVar155,auVar356);
            auVar83 = ZEXT1632(auVar181);
            auVar26._28_4_ = auVar111._28_4_;
            auVar26._0_28_ =
                 ZEXT1628(CONCAT412(auVar181._12_4_ * auVar181._12_4_,
                                    CONCAT48(auVar181._8_4_ * auVar181._8_4_,
                                             CONCAT44(auVar181._4_4_ * auVar181._4_4_,
                                                      auVar181._0_4_ * auVar181._0_4_))));
            auVar288._8_4_ = 0x39506967;
            auVar288._0_8_ = 0x3950696739506967;
            auVar288._12_4_ = 0x39506967;
            auVar288._16_4_ = 0x39506967;
            auVar288._20_4_ = 0x39506967;
            auVar288._24_4_ = 0x39506967;
            auVar288._28_4_ = 0x39506967;
            auVar376._8_4_ = 0x3ab743ce;
            auVar376._0_8_ = 0x3ab743ce3ab743ce;
            auVar376._12_4_ = 0x3ab743ce;
            auVar376._16_4_ = 0x3ab743ce;
            auVar376._20_4_ = 0x3ab743ce;
            auVar376._24_4_ = 0x3ab743ce;
            auVar376._28_4_ = 0x3ab743ce;
            auVar125 = vfmadd213ps_fma(auVar288,auVar83,auVar376);
            auVar377._8_4_ = 0x3c088908;
            auVar377._0_8_ = 0x3c0889083c088908;
            auVar377._12_4_ = 0x3c088908;
            auVar377._16_4_ = 0x3c088908;
            auVar377._20_4_ = 0x3c088908;
            auVar377._24_4_ = 0x3c088908;
            auVar377._28_4_ = 0x3c088908;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar377);
            auVar362._8_4_ = 0x3d2aa9c1;
            auVar362._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar362._12_4_ = 0x3d2aa9c1;
            auVar362._16_4_ = 0x3d2aa9c1;
            auVar362._20_4_ = 0x3d2aa9c1;
            auVar362._24_4_ = 0x3d2aa9c1;
            auVar362._28_4_ = 0x3d2aa9c1;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar362);
            auVar349._8_4_ = 0x3e2aaaaa;
            auVar349._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar349._12_4_ = 0x3e2aaaaa;
            auVar349._16_4_ = 0x3e2aaaaa;
            auVar349._20_4_ = 0x3e2aaaaa;
            auVar349._24_4_ = 0x3e2aaaaa;
            auVar349._28_4_ = 0x3e2aaaaa;
            auVar83 = ZEXT1632(auVar181);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar349);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar299);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar26,auVar83);
            auVar249._0_4_ = auVar125._0_4_ + 1.0;
            auVar249._4_4_ = auVar125._4_4_ + 1.0;
            auVar249._8_4_ = auVar125._8_4_ + 1.0;
            auVar249._12_4_ = auVar125._12_4_ + 1.0;
            auVar249._16_4_ = 0x3f800000;
            auVar249._20_4_ = 0x3f800000;
            auVar249._24_4_ = 0x3f800000;
            auVar249._28_4_ = 0x3f800000;
            auVar124._0_4_ = (int)auVar155._0_4_;
            auVar124._4_4_ = (int)auVar155._4_4_;
            auVar124._8_4_ = (int)auVar155._8_4_;
            auVar124._12_4_ = (int)auVar155._12_4_;
            auVar156._16_4_ = (int)auVar155._16_4_;
            auVar156._0_16_ = auVar124;
            auVar156._20_4_ = (int)auVar155._20_4_;
            auVar156._24_4_ = (int)auVar155._24_4_;
            auVar156._28_4_ = (int)auVar155._28_4_;
            auVar181 = vpslld_avx(auVar124,0x17);
            auVar125 = vpslld_avx(auVar156._16_16_,0x17);
            auVar64._8_4_ = 0x3f800000;
            auVar64._0_8_ = 0x3f8000003f800000;
            auVar64._12_4_ = 0x3f800000;
            auVar125 = vpaddd_avx(auVar125,auVar64);
            auVar181 = vpaddd_avx(auVar181,auVar64);
            auVar157._16_16_ = auVar125;
            auVar157._0_16_ = auVar181;
            auVar217 = vfmadd213ps_fma(auVar157,auVar249,auVar267);
            auVar198._8_4_ = 0x800000;
            auVar198._0_8_ = 0x80000000800000;
            auVar198._12_4_ = 0x800000;
            auVar198._16_4_ = 0x800000;
            auVar198._20_4_ = 0x800000;
            auVar198._24_4_ = 0x800000;
            auVar198._28_4_ = 0x800000;
            auVar155 = vmaxps_avx(ZEXT1632(auVar217),auVar198);
            auVar181 = vpsrld_avx(auVar155._0_16_,0x17);
            auVar125 = vpsrld_avx(auVar155._16_16_,0x17);
            auVar307._8_4_ = 0x807fffff;
            auVar307._0_8_ = 0x807fffff807fffff;
            auVar307._12_4_ = 0x807fffff;
            auVar307._16_4_ = 0x807fffff;
            auVar307._20_4_ = 0x807fffff;
            auVar307._24_4_ = 0x807fffff;
            auVar307._28_4_ = 0x807fffff;
            auVar155 = vandps_avx(auVar307,auVar155);
            auVar111 = vorps_avx(auVar299,auVar155);
            auVar308._8_4_ = 0x3f3504f3;
            auVar308._0_8_ = 0x3f3504f33f3504f3;
            auVar308._12_4_ = 0x3f3504f3;
            auVar308._16_4_ = 0x3f3504f3;
            auVar308._20_4_ = 0x3f3504f3;
            auVar308._24_4_ = 0x3f3504f3;
            auVar308._28_4_ = 0x3f3504f3;
            auVar83 = vcmpps_avx(auVar308,auVar111,2);
            auVar155 = vandnps_avx(auVar83,auVar111);
            auVar237._8_4_ = 0xbf800000;
            auVar237._0_8_ = 0xbf800000bf800000;
            auVar237._12_4_ = 0xbf800000;
            auVar237._16_4_ = 0xbf800000;
            auVar237._20_4_ = 0xbf800000;
            auVar237._24_4_ = 0xbf800000;
            auVar237._28_4_ = 0xbf800000;
            auVar199._0_4_ = auVar155._0_4_ + auVar111._0_4_ + -1.0;
            auVar199._4_4_ = auVar155._4_4_ + auVar111._4_4_ + -1.0;
            auVar199._8_4_ = auVar155._8_4_ + auVar111._8_4_ + -1.0;
            auVar199._12_4_ = auVar155._12_4_ + auVar111._12_4_ + -1.0;
            auVar199._16_4_ = auVar155._16_4_ + auVar111._16_4_ + -1.0;
            auVar199._20_4_ = auVar155._20_4_ + auVar111._20_4_ + -1.0;
            auVar199._24_4_ = auVar155._24_4_ + auVar111._24_4_ + -1.0;
            auVar199._28_4_ = auVar155._28_4_ + auVar111._28_4_ + -1.0;
            auVar125 = vpsubd_avx(auVar125,auVar83._16_16_);
            auVar316._8_4_ = 0xffffff81;
            auVar316._0_8_ = 0xffffff81ffffff81;
            auVar316._12_4_ = 0xffffff81;
            auVar125 = vpaddd_avx(auVar316,auVar125);
            auVar181 = vpsubd_avx(auVar181,auVar83._0_16_);
            auVar181 = vpaddd_avx(auVar316,auVar181);
            auVar250._16_16_ = auVar125;
            auVar250._0_16_ = auVar181;
            auVar289._0_4_ = auVar199._0_4_ * auVar199._0_4_;
            auVar289._4_4_ = auVar199._4_4_ * auVar199._4_4_;
            auVar289._8_4_ = auVar199._8_4_ * auVar199._8_4_;
            auVar289._12_4_ = auVar199._12_4_ * auVar199._12_4_;
            auVar289._16_4_ = auVar199._16_4_ * auVar199._16_4_;
            auVar289._20_4_ = auVar199._20_4_ * auVar199._20_4_;
            auVar289._24_4_ = auVar199._24_4_ * auVar199._24_4_;
            auVar289._28_4_ = 0;
            auVar309._8_4_ = 0x3d9021bb;
            auVar309._0_8_ = 0x3d9021bb3d9021bb;
            auVar309._12_4_ = 0x3d9021bb;
            auVar309._16_4_ = 0x3d9021bb;
            auVar309._20_4_ = 0x3d9021bb;
            auVar309._24_4_ = 0x3d9021bb;
            auVar309._28_4_ = 0x3d9021bb;
            auVar334._8_4_ = 0xbdebd1b8;
            auVar334._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar334._12_4_ = 0xbdebd1b8;
            auVar334._16_4_ = 0xbdebd1b8;
            auVar334._20_4_ = 0xbdebd1b8;
            auVar334._24_4_ = 0xbdebd1b8;
            auVar334._28_4_ = 0xbdebd1b8;
            auVar125 = vfmadd213ps_fma(auVar309,auVar199,auVar334);
            auVar335._8_4_ = 0x3def251a;
            auVar335._0_8_ = 0x3def251a3def251a;
            auVar335._12_4_ = 0x3def251a;
            auVar335._16_4_ = 0x3def251a;
            auVar335._20_4_ = 0x3def251a;
            auVar335._24_4_ = 0x3def251a;
            auVar335._28_4_ = 0x3def251a;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar199,auVar335);
            auVar336._8_4_ = 0xbdfe5d4f;
            auVar336._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar336._12_4_ = 0xbdfe5d4f;
            auVar336._16_4_ = 0xbdfe5d4f;
            auVar336._20_4_ = 0xbdfe5d4f;
            auVar336._24_4_ = 0xbdfe5d4f;
            auVar336._28_4_ = 0xbdfe5d4f;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar199,auVar336);
            auVar337._8_4_ = 0x3e11e9bf;
            auVar337._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar337._12_4_ = 0x3e11e9bf;
            auVar337._16_4_ = 0x3e11e9bf;
            auVar337._20_4_ = 0x3e11e9bf;
            auVar337._24_4_ = 0x3e11e9bf;
            auVar337._28_4_ = 0x3e11e9bf;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar199,auVar337);
            auVar338._8_4_ = 0xbe2aae50;
            auVar338._0_8_ = 0xbe2aae50be2aae50;
            auVar338._12_4_ = 0xbe2aae50;
            auVar338._16_4_ = 0xbe2aae50;
            auVar338._20_4_ = 0xbe2aae50;
            auVar338._24_4_ = 0xbe2aae50;
            auVar338._28_4_ = 0xbe2aae50;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar199,auVar338);
            auVar339._8_4_ = 0x3e4cceac;
            auVar339._0_8_ = 0x3e4cceac3e4cceac;
            auVar339._12_4_ = 0x3e4cceac;
            auVar339._16_4_ = 0x3e4cceac;
            auVar339._20_4_ = 0x3e4cceac;
            auVar339._24_4_ = 0x3e4cceac;
            auVar339._28_4_ = 0x3e4cceac;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar199,auVar339);
            auVar340._8_4_ = 0xbe7ffffc;
            auVar340._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar340._12_4_ = 0xbe7ffffc;
            auVar340._16_4_ = 0xbe7ffffc;
            auVar340._20_4_ = 0xbe7ffffc;
            auVar340._24_4_ = 0xbe7ffffc;
            auVar340._28_4_ = 0xbe7ffffc;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar199,auVar340);
            auVar341._8_4_ = 0x3eaaaaaa;
            auVar341._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar341._12_4_ = 0x3eaaaaaa;
            auVar341._16_4_ = 0x3eaaaaaa;
            auVar341._20_4_ = 0x3eaaaaaa;
            auVar341._24_4_ = 0x3eaaaaaa;
            auVar341._28_4_ = 0x3eaaaaaa;
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar199,auVar341);
            auVar310._0_4_ = auVar289._0_4_ * auVar199._0_4_ * auVar125._0_4_;
            auVar310._4_4_ = auVar289._4_4_ * auVar199._4_4_ * auVar125._4_4_;
            auVar310._8_4_ = auVar289._8_4_ * auVar199._8_4_ * auVar125._8_4_;
            auVar310._12_4_ = auVar289._12_4_ * auVar199._12_4_ * auVar125._12_4_;
            auVar310._16_4_ = auVar289._16_4_ * auVar199._16_4_ * 0.0;
            auVar310._20_4_ = auVar289._20_4_ * auVar199._20_4_ * 0.0;
            auVar310._24_4_ = auVar289._24_4_ * auVar199._24_4_ * 0.0;
            auVar310._28_4_ = 0;
            auVar83 = vcvtdq2ps_avx(auVar250);
            auVar125 = vfmadd231ps_fma(auVar310,auVar83,auVar356);
            auVar125 = vfmsub231ps_fma(ZEXT1632(auVar125),auVar299,auVar289);
            auVar155 = vcmpps_avx(ZEXT1632(auVar217),_DAT_005513a0,2);
            auVar111 = vsubps_avx(ZEXT1632(auVar125),auVar199);
            auVar125 = vfmsub231ps_fma(auVar111,auVar370,auVar83);
            auVar311._8_4_ = 0xc0000000;
            auVar311._0_8_ = 0xc0000000c0000000;
            auVar311._12_4_ = 0xc0000000;
            auVar311._16_4_ = 0xc0000000;
            auVar311._20_4_ = 0xc0000000;
            auVar311._24_4_ = 0xc0000000;
            auVar311._28_4_ = 0xc0000000;
            auVar200._0_4_ = auVar125._0_4_ * -2.0;
            auVar200._4_4_ = auVar125._4_4_ * -2.0;
            auVar200._8_4_ = auVar125._8_4_ * -2.0;
            auVar200._12_4_ = auVar125._12_4_ * -2.0;
            auVar200._16_4_ = 0x80000000;
            auVar200._20_4_ = 0x80000000;
            auVar200._24_4_ = 0x80000000;
            auVar200._28_4_ = 0;
            auVar251._8_4_ = 0x7fffffff;
            auVar251._0_8_ = 0x7fffffff7fffffff;
            auVar251._12_4_ = 0x7fffffff;
            auVar251._16_4_ = 0x7fffffff;
            auVar251._20_4_ = 0x7fffffff;
            auVar251._24_4_ = 0x7fffffff;
            auVar251._28_4_ = 0x7fffffff;
            auVar155 = vblendvps_avx(auVar200,auVar251,auVar155);
            auVar201._8_4_ = 0x42b0c0a5;
            auVar201._0_8_ = 0x42b0c0a542b0c0a5;
            auVar201._12_4_ = 0x42b0c0a5;
            auVar201._16_4_ = 0x42b0c0a5;
            auVar201._20_4_ = 0x42b0c0a5;
            auVar201._24_4_ = 0x42b0c0a5;
            auVar201._28_4_ = 0x42b0c0a5;
            auVar155 = vminps_avx(auVar155,auVar201);
            auVar202._8_4_ = 0xc2b0c0a5;
            auVar202._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar202._12_4_ = 0xc2b0c0a5;
            auVar202._16_4_ = 0xc2b0c0a5;
            auVar202._20_4_ = 0xc2b0c0a5;
            auVar202._24_4_ = 0xc2b0c0a5;
            auVar202._28_4_ = 0xc2b0c0a5;
            auVar83 = vmaxps_avx(auVar155,auVar202);
            auVar203._8_4_ = 0x3fb8aa3b;
            auVar203._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar203._12_4_ = 0x3fb8aa3b;
            auVar203._16_4_ = 0x3fb8aa3b;
            auVar203._20_4_ = 0x3fb8aa3b;
            auVar203._24_4_ = 0x3fb8aa3b;
            auVar203._28_4_ = 0x3fb8aa3b;
            auVar125 = vfmadd213ps_fma(auVar203,auVar83,auVar299);
            auVar111 = vroundps_avx(ZEXT1632(auVar125),1);
            auVar155 = vcmpps_avx(ZEXT1632(auVar125),auVar111,1);
            auVar155 = vandps_avx(auVar155,auVar267);
            auVar155 = vsubps_avx(auVar111,auVar155);
            auVar125 = vfmsub231ps_fma(auVar83,auVar155,auVar370);
            auVar181 = vfnmsub231ps_fma(ZEXT1632(auVar125),auVar155,auVar356);
            auVar83 = ZEXT1632(auVar181);
            auVar27._28_4_ = auVar111._28_4_;
            auVar27._0_28_ =
                 ZEXT1628(CONCAT412(auVar181._12_4_ * auVar181._12_4_,
                                    CONCAT48(auVar181._8_4_ * auVar181._8_4_,
                                             CONCAT44(auVar181._4_4_ * auVar181._4_4_,
                                                      auVar181._0_4_ * auVar181._0_4_))));
            auVar290._8_4_ = 0x39506967;
            auVar290._0_8_ = 0x3950696739506967;
            auVar290._12_4_ = 0x39506967;
            auVar290._16_4_ = 0x39506967;
            auVar290._20_4_ = 0x39506967;
            auVar290._24_4_ = 0x39506967;
            auVar290._28_4_ = 0x39506967;
            auVar342._8_4_ = 0x3ab743ce;
            auVar342._0_8_ = 0x3ab743ce3ab743ce;
            auVar342._12_4_ = 0x3ab743ce;
            auVar342._16_4_ = 0x3ab743ce;
            auVar342._20_4_ = 0x3ab743ce;
            auVar342._24_4_ = 0x3ab743ce;
            auVar342._28_4_ = 0x3ab743ce;
            auVar125 = vfmadd213ps_fma(auVar290,auVar83,auVar342);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar377);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar362);
            auVar83 = ZEXT1632(auVar181);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar349);
            auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar83,auVar299);
            auVar217 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar27,auVar83);
            auVar126._0_4_ = (int)auVar155._0_4_;
            auVar126._4_4_ = (int)auVar155._4_4_;
            auVar126._8_4_ = (int)auVar155._8_4_;
            auVar126._12_4_ = (int)auVar155._12_4_;
            auVar158._16_4_ = (int)auVar155._16_4_;
            auVar158._0_16_ = auVar126;
            auVar158._20_4_ = (int)auVar155._20_4_;
            auVar158._24_4_ = (int)auVar155._24_4_;
            auVar158._28_4_ = (int)auVar155._28_4_;
            auVar181 = vpslld_avx(auVar126,0x17);
            auVar125 = vpslld_avx(auVar158._16_16_,0x17);
            auVar125 = vpaddd_avx(auVar125,auVar64);
            auVar181 = vpaddd_avx(auVar181,auVar64);
            auVar159._16_16_ = auVar125;
            auVar159._0_16_ = auVar181;
            auVar204._0_4_ = auVar217._0_4_ + 1.0;
            auVar204._4_4_ = auVar217._4_4_ + 1.0;
            auVar204._8_4_ = auVar217._8_4_ + 1.0;
            auVar204._12_4_ = auVar217._12_4_ + 1.0;
            auVar204._16_4_ = 0x3f800000;
            auVar204._20_4_ = 0x3f800000;
            auVar204._24_4_ = 0x3f800000;
            auVar204._28_4_ = 0x3f800000;
            auVar125 = vfmadd213ps_fma(auVar159,auVar204,auVar267);
            auVar155 = vrcpps_avx(ZEXT1632(auVar125));
            auVar125 = vfmsub213ps_fma(ZEXT1632(auVar125),auVar155,auVar267);
            auVar125 = vfnmadd132ps_fma(ZEXT1632(auVar125),auVar155,auVar155);
            auVar125 = vfnmadd213ps_fma(ZEXT1632(auVar125),auVar311,auVar237);
            auVar154 = ZEXT1628(auVar125);
            goto LAB_0031f41f;
          case 6:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var22);
            auVar165._4_4_ = uVar1;
            auVar165._0_4_ = uVar1;
            auVar165._8_4_ = uVar1;
            auVar165._12_4_ = uVar1;
            auVar165._16_4_ = uVar1;
            auVar165._20_4_ = uVar1;
            auVar165._24_4_ = uVar1;
            auVar165._28_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var22))[1];
            auVar208._4_4_ = uVar1;
            auVar208._0_4_ = uVar1;
            auVar208._8_4_ = uVar1;
            auVar208._12_4_ = uVar1;
            auVar208._16_4_ = uVar1;
            auVar208._20_4_ = uVar1;
            auVar208._24_4_ = uVar1;
            auVar208._28_4_ = uVar1;
            auVar125 = vfmadd231ps_fma(auVar208,auVar106,auVar165);
            auVar155 = vmaxps_avx(ZEXT1632(auVar125),_DAT_005513a0);
            auVar155 = vminps_avx(auVar155,auVar267);
            auVar154 = auVar155._0_28_;
LAB_0031f41f:
            auVar106._4_4_ = auVar154._4_4_ * fVar123;
            auVar106._0_4_ = auVar154._0_4_ * fVar87;
            auVar106._8_4_ = auVar154._8_4_ * auVar106._8_4_;
            auVar106._12_4_ = auVar154._12_4_ * auVar106._12_4_;
            auVar106._16_4_ = auVar154._16_4_ * auVar106._16_4_;
            auVar106._20_4_ = auVar154._20_4_ * auVar106._20_4_;
            auVar106._24_4_ = auVar154._24_4_ * auVar106._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + lVar46 * 0x20) = auVar106;
          lVar46 = lVar46 + 1;
        } while (lVar46 != iVar36);
      }
      iVar36 = 0;
    }
  }
  piVar23 = (int *)CONCAT44(uStack_38c,uStack_390);
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 == 0) {
      if (local_378 == (Allocator *)0x0) {
        if (local_398 != (undefined1 (*) [32])0x0) {
          free(local_398);
        }
      }
      else {
        (*local_378->_vptr_Allocator[3])();
      }
    }
  }
  return iVar36;
}

Assistant:

int InnerProduct_x86_fma::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __AVX512F__
    if (out_elempack == 16)
    {
        innerproduct_fp16s_pack16_avx512(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }
#endif // __AVX512F__

    if (out_elempack == 8)
    {
        innerproduct_fp16s_pack8_avx(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 4)
    {
        innerproduct_fp16s_pack4_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 1)
    {
        innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    return 0;
}